

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx::CurveNiIntersectorK<4,4>::
     occluded_n<embree::avx::OrientedCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  BBox1f BVar2;
  Primitive PVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  void *pvVar6;
  __int_type_conflict _Var7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  LinearSpace3fa *pLVar53;
  uint uVar54;
  uint uVar55;
  long lVar56;
  uint uVar57;
  undefined4 uVar58;
  ulong uVar59;
  bool bVar60;
  ulong uVar61;
  bool bVar62;
  float fVar89;
  vint4 bi_1;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar67 [16];
  float fVar91;
  float fVar92;
  float fVar93;
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  float fVar90;
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  float fVar94;
  float fVar95;
  float fVar125;
  vint4 bi_2;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar126;
  undefined1 auVar100 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [32];
  undefined1 auVar101 [16];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  vint4 ai;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  float t1;
  float fVar153;
  float fVar163;
  float fVar164;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  float fVar165;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  float fVar166;
  undefined1 auVar162 [32];
  vint4 bi;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  float fVar182;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  float fVar183;
  float fVar198;
  float fVar199;
  vint4 ai_2;
  float fVar200;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  float fVar201;
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  vint4 ai_1;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  float fVar213;
  float fVar224;
  float fVar225;
  vfloat4 b0;
  undefined1 auVar214 [16];
  float fVar226;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [32];
  float fVar227;
  float fVar237;
  float fVar239;
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  float fVar238;
  float fVar240;
  float fVar241;
  undefined1 auVar236 [32];
  float fVar242;
  float fVar253;
  float fVar254;
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  float fVar256;
  float fVar257;
  float fVar258;
  undefined1 auVar251 [32];
  float fVar255;
  undefined1 auVar252 [32];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [32];
  vfloat4 a0;
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [32];
  float fVar272;
  float fVar276;
  float fVar277;
  vfloat4 a0_1;
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  float fVar278;
  undefined1 auVar275 [16];
  float fVar279;
  float fVar280;
  float fVar281;
  float fVar282;
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  float fVar287;
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar295 [64];
  undefined1 auVar296 [16];
  float fVar298;
  undefined1 auVar297 [64];
  vfloat_impl<4> p00;
  undefined1 local_5c8 [8];
  float fStack_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  undefined1 local_5a8 [8];
  float fStack_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float local_588;
  float fStack_584;
  float fStack_580;
  float fStack_57c;
  float local_4e8;
  float fStack_4e4;
  float fStack_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  undefined1 local_4a8 [16];
  undefined1 (*local_490) [16];
  LinearSpace3fa *local_488;
  ulong local_480;
  undefined1 local_478 [8];
  float fStack_470;
  float fStack_46c;
  undefined1 local_468 [8];
  float fStack_460;
  float fStack_45c;
  undefined1 local_458 [8];
  float fStack_450;
  float fStack_44c;
  undefined1 local_448 [8];
  float fStack_440;
  float fStack_43c;
  undefined1 local_438 [8];
  float fStack_430;
  float fStack_42c;
  undefined1 local_428 [8];
  float fStack_420;
  float fStack_41c;
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  undefined1 local_408 [8];
  float fStack_400;
  float fStack_3fc;
  undefined1 auStack_3f8 [16];
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  undefined8 local_368;
  undefined8 uStack_360;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  vfloat_impl<4> p03;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  BBox1f cu_stack [4];
  RTCHitN local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined1 local_1c8 [16];
  uint local_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint uStack_1a8;
  uint uStack_1a4;
  uint uStack_1a0;
  uint uStack_19c;
  undefined1 local_198 [32];
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  BBox1f cv_stack [4];
  undefined1 auVar212 [32];
  undefined1 auVar294 [32];
  
  PVar3 = prim[1];
  uVar59 = (ulong)(byte)PVar3;
  fVar213 = *(float *)(prim + uVar59 * 0x19 + 0x12);
  auVar219 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar219 = vinsertps_avx(auVar219,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar247 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar247 = vinsertps_avx(auVar247,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar219 = vsubps_avx(auVar219,*(undefined1 (*) [16])(prim + uVar59 * 0x19 + 6));
  auVar96._0_4_ = fVar213 * auVar219._0_4_;
  auVar96._4_4_ = fVar213 * auVar219._4_4_;
  auVar96._8_4_ = fVar213 * auVar219._8_4_;
  auVar96._12_4_ = fVar213 * auVar219._12_4_;
  auVar71._0_4_ = fVar213 * auVar247._0_4_;
  auVar71._4_4_ = fVar213 * auVar247._4_4_;
  auVar71._8_4_ = fVar213 * auVar247._8_4_;
  auVar71._12_4_ = fVar213 * auVar247._12_4_;
  auVar219 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 4 + 6)));
  auVar219 = vcvtdq2ps_avx(auVar219);
  auVar247 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 5 + 6)));
  auVar247 = vcvtdq2ps_avx(auVar247);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 6 + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 0xb + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 0xc + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 0xd + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar64 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 0x12 + 6)));
  auVar64 = vcvtdq2ps_avx(auVar64);
  auVar65 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 0x13 + 6)));
  auVar65 = vcvtdq2ps_avx(auVar65);
  auVar98 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 0x14 + 6)));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar63 = vshufps_avx(auVar71,auVar71,0);
  auVar97 = vshufps_avx(auVar71,auVar71,0x55);
  auVar127 = vshufps_avx(auVar71,auVar71,0xaa);
  fVar213 = auVar127._0_4_;
  fVar183 = auVar127._4_4_;
  fVar153 = auVar127._8_4_;
  fVar224 = auVar127._12_4_;
  fVar164 = auVar97._0_4_;
  fVar226 = auVar97._4_4_;
  fVar200 = auVar97._8_4_;
  fVar165 = auVar97._12_4_;
  fVar198 = auVar63._0_4_;
  fVar163 = auVar63._4_4_;
  fVar225 = auVar63._8_4_;
  fVar199 = auVar63._12_4_;
  auVar134._0_4_ = fVar198 * auVar219._0_4_ + fVar164 * auVar247._0_4_ + fVar213 * auVar11._0_4_;
  auVar134._4_4_ = fVar163 * auVar219._4_4_ + fVar226 * auVar247._4_4_ + fVar183 * auVar11._4_4_;
  auVar134._8_4_ = fVar225 * auVar219._8_4_ + fVar200 * auVar247._8_4_ + fVar153 * auVar11._8_4_;
  auVar134._12_4_ = fVar199 * auVar219._12_4_ + fVar165 * auVar247._12_4_ + fVar224 * auVar11._12_4_
  ;
  auVar104._0_4_ = fVar198 * auVar12._0_4_ + fVar164 * auVar13._0_4_ + auVar14._0_4_ * fVar213;
  auVar104._4_4_ = fVar163 * auVar12._4_4_ + fVar226 * auVar13._4_4_ + auVar14._4_4_ * fVar183;
  auVar104._8_4_ = fVar225 * auVar12._8_4_ + fVar200 * auVar13._8_4_ + auVar14._8_4_ * fVar153;
  auVar104._12_4_ = fVar199 * auVar12._12_4_ + fVar165 * auVar13._12_4_ + auVar14._12_4_ * fVar224;
  auVar214._0_4_ = fVar198 * auVar64._0_4_ + fVar164 * auVar65._0_4_ + auVar98._0_4_ * fVar213;
  auVar214._4_4_ = fVar163 * auVar64._4_4_ + fVar226 * auVar65._4_4_ + auVar98._4_4_ * fVar183;
  auVar214._8_4_ = fVar225 * auVar64._8_4_ + fVar200 * auVar65._8_4_ + auVar98._8_4_ * fVar153;
  auVar214._12_4_ = fVar199 * auVar64._12_4_ + fVar165 * auVar65._12_4_ + auVar98._12_4_ * fVar224;
  auVar63 = vshufps_avx(auVar96,auVar96,0);
  auVar97 = vshufps_avx(auVar96,auVar96,0x55);
  auVar127 = vshufps_avx(auVar96,auVar96,0xaa);
  fVar213 = auVar127._0_4_;
  fVar183 = auVar127._4_4_;
  fVar153 = auVar127._8_4_;
  fVar224 = auVar127._12_4_;
  fVar164 = auVar97._0_4_;
  fVar226 = auVar97._4_4_;
  fVar200 = auVar97._8_4_;
  fVar165 = auVar97._12_4_;
  fVar198 = auVar63._0_4_;
  fVar163 = auVar63._4_4_;
  fVar225 = auVar63._8_4_;
  fVar199 = auVar63._12_4_;
  auVar202._0_4_ = fVar198 * auVar219._0_4_ + fVar164 * auVar247._0_4_ + fVar213 * auVar11._0_4_;
  auVar202._4_4_ = fVar163 * auVar219._4_4_ + fVar226 * auVar247._4_4_ + fVar183 * auVar11._4_4_;
  auVar202._8_4_ = fVar225 * auVar219._8_4_ + fVar200 * auVar247._8_4_ + fVar153 * auVar11._8_4_;
  auVar202._12_4_ = fVar199 * auVar219._12_4_ + fVar165 * auVar247._12_4_ + fVar224 * auVar11._12_4_
  ;
  auVar63._0_4_ = fVar198 * auVar12._0_4_ + auVar14._0_4_ * fVar213 + fVar164 * auVar13._0_4_;
  auVar63._4_4_ = fVar163 * auVar12._4_4_ + auVar14._4_4_ * fVar183 + fVar226 * auVar13._4_4_;
  auVar63._8_4_ = fVar225 * auVar12._8_4_ + auVar14._8_4_ * fVar153 + fVar200 * auVar13._8_4_;
  auVar63._12_4_ = fVar199 * auVar12._12_4_ + auVar14._12_4_ * fVar224 + fVar165 * auVar13._12_4_;
  auVar148._8_4_ = 0x7fffffff;
  auVar148._0_8_ = 0x7fffffff7fffffff;
  auVar148._12_4_ = 0x7fffffff;
  auVar219 = vandps_avx(auVar134,auVar148);
  auVar167._8_4_ = 0x219392ef;
  auVar167._0_8_ = 0x219392ef219392ef;
  auVar167._12_4_ = 0x219392ef;
  auVar219 = vcmpps_avx(auVar219,auVar167,1);
  auVar247 = vblendvps_avx(auVar134,auVar167,auVar219);
  auVar219 = vandps_avx(auVar104,auVar148);
  auVar219 = vcmpps_avx(auVar219,auVar167,1);
  auVar11 = vblendvps_avx(auVar104,auVar167,auVar219);
  auVar219 = vandps_avx(auVar148,auVar214);
  auVar219 = vcmpps_avx(auVar219,auVar167,1);
  auVar219 = vblendvps_avx(auVar214,auVar167,auVar219);
  auVar97._0_4_ = fVar198 * auVar64._0_4_ + fVar164 * auVar65._0_4_ + auVar98._0_4_ * fVar213;
  auVar97._4_4_ = fVar163 * auVar64._4_4_ + fVar226 * auVar65._4_4_ + auVar98._4_4_ * fVar183;
  auVar97._8_4_ = fVar225 * auVar64._8_4_ + fVar200 * auVar65._8_4_ + auVar98._8_4_ * fVar153;
  auVar97._12_4_ = fVar199 * auVar64._12_4_ + fVar165 * auVar65._12_4_ + auVar98._12_4_ * fVar224;
  auVar12 = vrcpps_avx(auVar247);
  fVar213 = auVar12._0_4_;
  auVar154._0_4_ = fVar213 * auVar247._0_4_;
  fVar224 = auVar12._4_4_;
  auVar154._4_4_ = fVar224 * auVar247._4_4_;
  fVar225 = auVar12._8_4_;
  auVar154._8_4_ = fVar225 * auVar247._8_4_;
  fVar226 = auVar12._12_4_;
  auVar154._12_4_ = fVar226 * auVar247._12_4_;
  auVar115._8_4_ = 0x3f800000;
  auVar115._0_8_ = 0x3f8000003f800000;
  auVar115._12_4_ = 0x3f800000;
  auVar247 = vsubps_avx(auVar115,auVar154);
  fVar213 = fVar213 + fVar213 * auVar247._0_4_;
  fVar224 = fVar224 + fVar224 * auVar247._4_4_;
  fVar225 = fVar225 + fVar225 * auVar247._8_4_;
  fVar226 = fVar226 + fVar226 * auVar247._12_4_;
  auVar247 = vrcpps_avx(auVar11);
  fVar183 = auVar247._0_4_;
  auVar155._0_4_ = fVar183 * auVar11._0_4_;
  fVar198 = auVar247._4_4_;
  auVar155._4_4_ = fVar198 * auVar11._4_4_;
  fVar199 = auVar247._8_4_;
  auVar155._8_4_ = fVar199 * auVar11._8_4_;
  fVar200 = auVar247._12_4_;
  auVar155._12_4_ = fVar200 * auVar11._12_4_;
  auVar247 = vsubps_avx(auVar115,auVar155);
  fVar183 = fVar183 + fVar183 * auVar247._0_4_;
  fVar198 = fVar198 + fVar198 * auVar247._4_4_;
  fVar199 = fVar199 + fVar199 * auVar247._8_4_;
  fVar200 = fVar200 + fVar200 * auVar247._12_4_;
  auVar247 = vrcpps_avx(auVar219);
  fVar153 = auVar247._0_4_;
  auVar156._0_4_ = fVar153 * auVar219._0_4_;
  fVar163 = auVar247._4_4_;
  auVar156._4_4_ = fVar163 * auVar219._4_4_;
  fVar164 = auVar247._8_4_;
  auVar156._8_4_ = fVar164 * auVar219._8_4_;
  fVar165 = auVar247._12_4_;
  auVar156._12_4_ = fVar165 * auVar219._12_4_;
  auVar219 = vsubps_avx(auVar115,auVar156);
  fVar153 = fVar153 + fVar153 * auVar219._0_4_;
  fVar163 = fVar163 + fVar163 * auVar219._4_4_;
  fVar164 = fVar164 + fVar164 * auVar219._8_4_;
  fVar165 = fVar165 + fVar165 * auVar219._12_4_;
  auVar219._8_8_ = 0;
  auVar219._0_8_ = *(ulong *)(prim + uVar59 * 7 + 6);
  auVar219 = vpmovsxwd_avx(auVar219);
  auVar219 = vcvtdq2ps_avx(auVar219);
  auVar219 = vsubps_avx(auVar219,auVar202);
  auVar127._0_4_ = fVar213 * auVar219._0_4_;
  auVar127._4_4_ = fVar224 * auVar219._4_4_;
  auVar127._8_4_ = fVar225 * auVar219._8_4_;
  auVar127._12_4_ = fVar226 * auVar219._12_4_;
  auVar247._8_8_ = 0;
  auVar247._0_8_ = *(ulong *)(prim + uVar59 * 9 + 6);
  auVar219 = vpmovsxwd_avx(auVar247);
  auVar219 = vcvtdq2ps_avx(auVar219);
  auVar219 = vsubps_avx(auVar219,auVar202);
  auVar168._0_4_ = fVar213 * auVar219._0_4_;
  auVar168._4_4_ = fVar224 * auVar219._4_4_;
  auVar168._8_4_ = fVar225 * auVar219._8_4_;
  auVar168._12_4_ = fVar226 * auVar219._12_4_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar59 * 0xe + 6);
  auVar219 = vpmovsxwd_avx(auVar11);
  auVar219 = vcvtdq2ps_avx(auVar219);
  auVar219 = vsubps_avx(auVar219,auVar63);
  auVar203._0_4_ = auVar219._0_4_ * fVar183;
  auVar203._4_4_ = auVar219._4_4_ * fVar198;
  auVar203._8_4_ = auVar219._8_4_ * fVar199;
  auVar203._12_4_ = auVar219._12_4_ * fVar200;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar219 = vpmovsxwd_avx(auVar12);
  auVar219 = vcvtdq2ps_avx(auVar219);
  auVar219 = vsubps_avx(auVar219,auVar63);
  auVar64._0_4_ = fVar183 * auVar219._0_4_;
  auVar64._4_4_ = fVar198 * auVar219._4_4_;
  auVar64._8_4_ = fVar199 * auVar219._8_4_;
  auVar64._12_4_ = fVar200 * auVar219._12_4_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar59 * 0x15 + 6);
  auVar219 = vpmovsxwd_avx(auVar13);
  auVar219 = vcvtdq2ps_avx(auVar219);
  auVar219 = vsubps_avx(auVar219,auVar97);
  auVar184._0_4_ = auVar219._0_4_ * fVar153;
  auVar184._4_4_ = auVar219._4_4_ * fVar163;
  auVar184._8_4_ = auVar219._8_4_ * fVar164;
  auVar184._12_4_ = auVar219._12_4_ * fVar165;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar59 * 0x17 + 6);
  auVar219 = vpmovsxwd_avx(auVar14);
  auVar219 = vcvtdq2ps_avx(auVar219);
  auVar219 = vsubps_avx(auVar219,auVar97);
  auVar98._0_4_ = auVar219._0_4_ * fVar153;
  auVar98._4_4_ = auVar219._4_4_ * fVar163;
  auVar98._8_4_ = auVar219._8_4_ * fVar164;
  auVar98._12_4_ = auVar219._12_4_ * fVar165;
  auVar219 = vpminsd_avx(auVar127,auVar168);
  auVar247 = vpminsd_avx(auVar203,auVar64);
  auVar219 = vmaxps_avx(auVar219,auVar247);
  auVar247 = vpminsd_avx(auVar184,auVar98);
  uVar58 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar103._4_4_ = uVar58;
  auVar103._0_4_ = uVar58;
  auVar103._8_4_ = uVar58;
  auVar103._12_4_ = uVar58;
  auVar247 = vmaxps_avx(auVar247,auVar103);
  auVar219 = vmaxps_avx(auVar219,auVar247);
  auVar157._0_4_ = auVar219._0_4_ * 0.99999964;
  auVar157._4_4_ = auVar219._4_4_ * 0.99999964;
  auVar157._8_4_ = auVar219._8_4_ * 0.99999964;
  auVar157._12_4_ = auVar219._12_4_ * 0.99999964;
  auVar219 = vpmaxsd_avx(auVar127,auVar168);
  auVar247 = vpmaxsd_avx(auVar203,auVar64);
  auVar219 = vminps_avx(auVar219,auVar247);
  auVar247 = vpmaxsd_avx(auVar184,auVar98);
  uVar58 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar128._4_4_ = uVar58;
  auVar128._0_4_ = uVar58;
  auVar128._8_4_ = uVar58;
  auVar128._12_4_ = uVar58;
  auVar247 = vminps_avx(auVar247,auVar128);
  auVar219 = vminps_avx(auVar219,auVar247);
  auVar65._0_4_ = auVar219._0_4_ * 1.0000004;
  auVar65._4_4_ = auVar219._4_4_ * 1.0000004;
  auVar65._8_4_ = auVar219._8_4_ * 1.0000004;
  auVar65._12_4_ = auVar219._12_4_ * 1.0000004;
  auVar219 = vpshufd_avx(ZEXT116((byte)PVar3),0);
  auVar247 = vpcmpgtd_avx(auVar219,_DAT_01f4ad30);
  auVar219 = vcmpps_avx(auVar157,auVar65,2);
  auVar219 = vandps_avx(auVar219,auVar247);
  uVar58 = vmovmskps_avx(auVar219);
  local_480 = CONCAT44((int)((ulong)ray >> 0x20),uVar58);
  local_488 = pre->ray_space + k;
  auVar83._16_16_ = mm_lookupmask_ps._240_16_;
  auVar83._0_16_ = mm_lookupmask_ps._240_16_;
  local_198 = vblendps_avx(auVar83,ZEXT832(0) << 0x20,0x80);
  local_490 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
LAB_007cecdc:
  pLVar53 = local_488;
  if (local_480 == 0) {
LAB_007d0bcd:
    return local_480 != 0;
  }
  lVar56 = 0;
  if (local_480 != 0) {
    for (; (local_480 >> lVar56 & 1) == 0; lVar56 = lVar56 + 1) {
    }
  }
  uVar55 = *(uint *)(prim + 2);
  pGVar4 = (context->scene->geometries).items[uVar55].ptr;
  uVar59 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar56 * 4 + 6));
  p_Var5 = pGVar4[1].intersectionFilterN;
  pvVar6 = pGVar4[2].userPtr;
  _Var7 = pGVar4[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar219 = *(undefined1 (*) [16])(_Var7 + uVar59 * (long)pvVar6);
  pfVar1 = (float *)(_Var7 + (uVar59 + 1) * (long)pvVar6);
  fVar213 = *pfVar1;
  fVar183 = pfVar1[1];
  fVar153 = pfVar1[2];
  fVar224 = pfVar1[3];
  pfVar1 = (float *)(_Var7 + (uVar59 + 2) * (long)pvVar6);
  fVar198 = *pfVar1;
  fVar163 = pfVar1[1];
  fVar225 = pfVar1[2];
  fVar199 = pfVar1[3];
  pfVar1 = (float *)(_Var7 + (long)pvVar6 * (uVar59 + 3));
  fVar164 = *pfVar1;
  fVar226 = pfVar1[1];
  fVar200 = pfVar1[2];
  fVar165 = pfVar1[3];
  lVar8 = *(long *)&pGVar4[1].time_range.upper;
  pfVar1 = (float *)(lVar8 + (long)p_Var5 * uVar59);
  fVar94 = *pfVar1;
  fVar95 = pfVar1[1];
  fVar125 = pfVar1[2];
  fVar126 = pfVar1[3];
  pfVar1 = (float *)(lVar8 + (long)p_Var5 * (uVar59 + 1));
  fVar89 = *pfVar1;
  fVar90 = pfVar1[1];
  fVar91 = pfVar1[2];
  fVar92 = pfVar1[3];
  uVar61 = local_480 - 1 & local_480;
  pfVar1 = (float *)(lVar8 + (long)p_Var5 * (uVar59 + 2));
  fVar93 = *pfVar1;
  fVar166 = pfVar1[1];
  fVar201 = pfVar1[2];
  fVar182 = pfVar1[3];
  lVar9 = 0;
  if (uVar61 != 0) {
    for (; (uVar61 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
    }
  }
  pfVar1 = (float *)(lVar8 + (long)p_Var5 * (uVar59 + 3));
  fVar227 = *pfVar1;
  fVar237 = pfVar1[1];
  fVar238 = pfVar1[2];
  fVar272 = pfVar1[3];
  if (((uVar61 != 0) && (uVar59 = uVar61 - 1 & uVar61, uVar59 != 0)) && (lVar8 = 0, uVar59 != 0)) {
    for (; (uVar59 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
    }
  }
  auVar247 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar11 = vinsertps_avx(auVar247,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  local_5c8._0_4_ = fVar94 * 0.16666667 + fVar89 * 0.6666667 + fVar93 * 0.16666667 + fVar227 * 0.0;
  local_5c8._4_4_ = fVar95 * 0.16666667 + fVar90 * 0.6666667 + fVar166 * 0.16666667 + fVar237 * 0.0;
  fStack_5c0 = fVar125 * 0.16666667 + fVar91 * 0.6666667 + fVar201 * 0.16666667 + fVar238 * 0.0;
  fStack_5bc = fVar126 * 0.16666667 + fVar92 * 0.6666667 + fVar182 * 0.16666667 + fVar272 * 0.0;
  auVar129._0_4_ = fVar93 * 0.5 + fVar227 * 0.0;
  auVar129._4_4_ = fVar166 * 0.5 + fVar237 * 0.0;
  auVar129._8_4_ = fVar201 * 0.5 + fVar238 * 0.0;
  auVar129._12_4_ = fVar182 * 0.5 + fVar272 * 0.0;
  auVar265._0_4_ = fVar89 * 0.0;
  auVar265._4_4_ = fVar90 * 0.0;
  auVar265._8_4_ = fVar91 * 0.0;
  auVar265._12_4_ = fVar92 * 0.0;
  auVar247 = vsubps_avx(auVar129,auVar265);
  auVar266._0_4_ = fVar94 * 0.5;
  auVar266._4_4_ = fVar95 * 0.5;
  auVar266._8_4_ = fVar125 * 0.5;
  auVar266._12_4_ = fVar126 * 0.5;
  auVar98 = vsubps_avx(auVar247,auVar266);
  fVar239 = auVar219._0_4_;
  fVar276 = auVar219._4_4_;
  fVar240 = auVar219._8_4_;
  fVar277 = auVar219._12_4_;
  auVar267._0_4_ = fVar239 * 0.16666667 + fVar213 * 0.6666667 + fVar198 * 0.16666667 + fVar164 * 0.0
  ;
  auVar267._4_4_ = fVar276 * 0.16666667 + fVar183 * 0.6666667 + fVar163 * 0.16666667 + fVar226 * 0.0
  ;
  auVar267._8_4_ = fVar240 * 0.16666667 + fVar153 * 0.6666667 + fVar225 * 0.16666667 + fVar200 * 0.0
  ;
  auVar267._12_4_ =
       fVar277 * 0.16666667 + fVar224 * 0.6666667 + fVar199 * 0.16666667 + fVar165 * 0.0;
  auVar273._0_4_ = fVar198 * 0.5 + fVar164 * 0.0;
  auVar273._4_4_ = fVar163 * 0.5 + fVar226 * 0.0;
  auVar273._8_4_ = fVar225 * 0.5 + fVar200 * 0.0;
  auVar273._12_4_ = fVar199 * 0.5 + fVar165 * 0.0;
  auVar283._0_4_ = fVar213 * 0.0;
  auVar283._4_4_ = fVar183 * 0.0;
  auVar283._8_4_ = fVar153 * 0.0;
  auVar283._12_4_ = fVar224 * 0.0;
  auVar219 = vsubps_avx(auVar273,auVar283);
  auVar284._0_4_ = fVar239 * 0.5;
  auVar284._4_4_ = fVar276 * 0.5;
  auVar284._8_4_ = fVar240 * 0.5;
  auVar284._12_4_ = fVar277 * 0.5;
  auVar13 = vsubps_avx(auVar219,auVar284);
  auVar288._0_4_ = fVar94 * 0.0;
  auVar288._4_4_ = fVar95 * 0.0;
  auVar288._8_4_ = fVar125 * 0.0;
  auVar288._12_4_ = fVar126 * 0.0;
  local_5a8._0_4_ = auVar288._0_4_ + fVar89 * 0.16666667 + fVar93 * 0.6666667 + fVar227 * 0.16666667
  ;
  local_5a8._4_4_ =
       auVar288._4_4_ + fVar90 * 0.16666667 + fVar166 * 0.6666667 + fVar237 * 0.16666667;
  fStack_5a0 = auVar288._8_4_ + fVar91 * 0.16666667 + fVar201 * 0.6666667 + fVar238 * 0.16666667;
  fStack_59c = auVar288._12_4_ + fVar92 * 0.16666667 + fVar182 * 0.6666667 + fVar272 * 0.16666667;
  auVar243._0_4_ = fVar93 * 0.0 + fVar227 * 0.5;
  auVar243._4_4_ = fVar166 * 0.0 + fVar237 * 0.5;
  auVar243._8_4_ = fVar201 * 0.0 + fVar238 * 0.5;
  auVar243._12_4_ = fVar182 * 0.0 + fVar272 * 0.5;
  auVar169._0_4_ = fVar89 * 0.5;
  auVar169._4_4_ = fVar90 * 0.5;
  auVar169._8_4_ = fVar91 * 0.5;
  auVar169._12_4_ = fVar92 * 0.5;
  auVar219 = vsubps_avx(auVar243,auVar169);
  auVar63 = vsubps_avx(auVar219,auVar288);
  auVar204._0_4_ = fVar239 * 0.0;
  auVar204._4_4_ = fVar276 * 0.0;
  auVar204._8_4_ = fVar240 * 0.0;
  auVar204._12_4_ = fVar277 * 0.0;
  auVar244._0_4_ =
       fVar213 * 0.16666667 + fVar198 * 0.6666667 + fVar164 * 0.16666667 + auVar204._0_4_;
  auVar244._4_4_ =
       fVar183 * 0.16666667 + fVar163 * 0.6666667 + fVar226 * 0.16666667 + auVar204._4_4_;
  auVar244._8_4_ =
       fVar153 * 0.16666667 + fVar225 * 0.6666667 + fVar200 * 0.16666667 + auVar204._8_4_;
  auVar244._12_4_ =
       fVar224 * 0.16666667 + fVar199 * 0.6666667 + fVar165 * 0.16666667 + auVar204._12_4_;
  auVar215._0_4_ = fVar164 * 0.5 + fVar198 * 0.0;
  auVar215._4_4_ = fVar226 * 0.5 + fVar163 * 0.0;
  auVar215._8_4_ = fVar200 * 0.5 + fVar225 * 0.0;
  auVar215._12_4_ = fVar165 * 0.5 + fVar199 * 0.0;
  auVar185._0_4_ = fVar213 * 0.5;
  auVar185._4_4_ = fVar183 * 0.5;
  auVar185._8_4_ = fVar153 * 0.5;
  auVar185._12_4_ = fVar224 * 0.5;
  auVar219 = vsubps_avx(auVar215,auVar185);
  auVar64 = vsubps_avx(auVar219,auVar204);
  auVar219 = vshufps_avx(auVar98,auVar98,0xc9);
  auVar247 = vshufps_avx(auVar267,auVar267,0xc9);
  fVar89 = auVar98._0_4_;
  auVar216._0_4_ = fVar89 * auVar247._0_4_;
  fVar90 = auVar98._4_4_;
  auVar216._4_4_ = fVar90 * auVar247._4_4_;
  fVar91 = auVar98._8_4_;
  auVar216._8_4_ = fVar91 * auVar247._8_4_;
  fVar92 = auVar98._12_4_;
  auVar216._12_4_ = fVar92 * auVar247._12_4_;
  auVar228._0_4_ = auVar267._0_4_ * auVar219._0_4_;
  auVar228._4_4_ = auVar267._4_4_ * auVar219._4_4_;
  auVar228._8_4_ = auVar267._8_4_ * auVar219._8_4_;
  auVar228._12_4_ = auVar267._12_4_ * auVar219._12_4_;
  auVar247 = vsubps_avx(auVar228,auVar216);
  auVar12 = vshufps_avx(auVar247,auVar247,0xc9);
  auVar247 = vshufps_avx(auVar13,auVar13,0xc9);
  auVar217._0_4_ = fVar89 * auVar247._0_4_;
  auVar217._4_4_ = fVar90 * auVar247._4_4_;
  auVar217._8_4_ = fVar91 * auVar247._8_4_;
  auVar217._12_4_ = fVar92 * auVar247._12_4_;
  auVar186._0_4_ = auVar13._0_4_ * auVar219._0_4_;
  auVar186._4_4_ = auVar13._4_4_ * auVar219._4_4_;
  auVar186._8_4_ = auVar13._8_4_ * auVar219._8_4_;
  auVar186._12_4_ = auVar13._12_4_ * auVar219._12_4_;
  auVar219 = vsubps_avx(auVar186,auVar217);
  auVar13 = vshufps_avx(auVar219,auVar219,0xc9);
  auVar219 = vshufps_avx(auVar63,auVar63,0xc9);
  auVar247 = vshufps_avx(auVar244,auVar244,0xc9);
  fVar93 = auVar63._0_4_;
  auVar187._0_4_ = fVar93 * auVar247._0_4_;
  fVar166 = auVar63._4_4_;
  auVar187._4_4_ = fVar166 * auVar247._4_4_;
  fVar201 = auVar63._8_4_;
  auVar187._8_4_ = fVar201 * auVar247._8_4_;
  fVar182 = auVar63._12_4_;
  auVar187._12_4_ = fVar182 * auVar247._12_4_;
  auVar245._0_4_ = auVar244._0_4_ * auVar219._0_4_;
  auVar245._4_4_ = auVar244._4_4_ * auVar219._4_4_;
  auVar245._8_4_ = auVar244._8_4_ * auVar219._8_4_;
  auVar245._12_4_ = auVar244._12_4_ * auVar219._12_4_;
  auVar247 = vsubps_avx(auVar245,auVar187);
  auVar14 = vshufps_avx(auVar247,auVar247,0xc9);
  auVar247 = vshufps_avx(auVar64,auVar64,0xc9);
  auVar246._0_4_ = auVar247._0_4_ * fVar93;
  auVar246._4_4_ = auVar247._4_4_ * fVar166;
  auVar246._8_4_ = auVar247._8_4_ * fVar201;
  auVar246._12_4_ = auVar247._12_4_ * fVar182;
  auVar205._0_4_ = auVar219._0_4_ * auVar64._0_4_;
  auVar205._4_4_ = auVar219._4_4_ * auVar64._4_4_;
  auVar205._8_4_ = auVar219._8_4_ * auVar64._8_4_;
  auVar205._12_4_ = auVar219._12_4_ * auVar64._12_4_;
  auVar247 = vsubps_avx(auVar205,auVar246);
  auVar219 = vdpps_avx(auVar12,auVar12,0x7f);
  auVar64 = vshufps_avx(auVar247,auVar247,0xc9);
  fVar198 = auVar219._0_4_;
  auVar127 = ZEXT416((uint)fVar198);
  auVar247 = vrsqrtss_avx(auVar127,auVar127);
  fVar213 = auVar247._0_4_;
  auVar247 = vdpps_avx(auVar12,auVar13,0x7f);
  auVar65 = ZEXT416((uint)(fVar213 * 1.5 - fVar198 * 0.5 * fVar213 * fVar213 * fVar213));
  auVar65 = vshufps_avx(auVar65,auVar65,0);
  fVar213 = auVar12._0_4_ * auVar65._0_4_;
  fVar183 = auVar12._4_4_ * auVar65._4_4_;
  fVar153 = auVar12._8_4_ * auVar65._8_4_;
  fVar224 = auVar12._12_4_ * auVar65._12_4_;
  auVar219 = vshufps_avx(auVar219,auVar219,0);
  auVar259._0_4_ = auVar13._0_4_ * auVar219._0_4_;
  auVar259._4_4_ = auVar13._4_4_ * auVar219._4_4_;
  auVar259._8_4_ = auVar13._8_4_ * auVar219._8_4_;
  auVar259._12_4_ = auVar13._12_4_ * auVar219._12_4_;
  auVar219 = vshufps_avx(auVar247,auVar247,0);
  auVar229._0_4_ = auVar12._0_4_ * auVar219._0_4_;
  auVar229._4_4_ = auVar12._4_4_ * auVar219._4_4_;
  auVar229._8_4_ = auVar12._8_4_ * auVar219._8_4_;
  auVar229._12_4_ = auVar12._12_4_ * auVar219._12_4_;
  auVar97 = vsubps_avx(auVar259,auVar229);
  auVar247 = vrcpss_avx(auVar127,auVar127);
  auVar219 = vdpps_avx(auVar14,auVar14,0x7f);
  auVar247 = ZEXT416((uint)(auVar247._0_4_ * (2.0 - fVar198 * auVar247._0_4_)));
  auVar12 = vshufps_avx(auVar247,auVar247,0);
  fVar198 = auVar219._0_4_;
  auVar127 = ZEXT416((uint)fVar198);
  auVar247 = vrsqrtss_avx(auVar127,auVar127);
  fVar163 = auVar247._0_4_;
  auVar247 = ZEXT416((uint)(fVar163 * 1.5 - fVar198 * 0.5 * fVar163 * fVar163 * fVar163));
  auVar13 = vshufps_avx(auVar247,auVar247,0);
  auVar247 = vdpps_avx(auVar14,auVar64,0x7f);
  fVar163 = auVar13._0_4_ * auVar14._0_4_;
  fVar225 = auVar13._4_4_ * auVar14._4_4_;
  fVar199 = auVar13._8_4_ * auVar14._8_4_;
  fVar164 = auVar13._12_4_ * auVar14._12_4_;
  auVar219 = vshufps_avx(auVar219,auVar219,0);
  auVar218._0_4_ = auVar219._0_4_ * auVar64._0_4_;
  auVar218._4_4_ = auVar219._4_4_ * auVar64._4_4_;
  auVar218._8_4_ = auVar219._8_4_ * auVar64._8_4_;
  auVar218._12_4_ = auVar219._12_4_ * auVar64._12_4_;
  auVar219 = vshufps_avx(auVar247,auVar247,0);
  auVar188._0_4_ = auVar219._0_4_ * auVar14._0_4_;
  auVar188._4_4_ = auVar219._4_4_ * auVar14._4_4_;
  auVar188._8_4_ = auVar219._8_4_ * auVar14._8_4_;
  auVar188._12_4_ = auVar219._12_4_ * auVar14._12_4_;
  auVar64 = vsubps_avx(auVar218,auVar188);
  auVar219 = vrcpss_avx(auVar127,auVar127);
  auVar219 = ZEXT416((uint)((2.0 - fVar198 * auVar219._0_4_) * auVar219._0_4_));
  auVar219 = vshufps_avx(auVar219,auVar219,0);
  auVar247 = vshufps_avx(_local_5c8,_local_5c8,0xff);
  auVar248._0_4_ = auVar247._0_4_ * fVar213;
  auVar248._4_4_ = auVar247._4_4_ * fVar183;
  auVar248._8_4_ = auVar247._8_4_ * fVar153;
  auVar248._12_4_ = auVar247._12_4_ * fVar224;
  _local_418 = vsubps_avx(_local_5c8,auVar248);
  auVar14 = vshufps_avx(auVar98,auVar98,0xff);
  auVar206._0_4_ =
       auVar14._0_4_ * fVar213 + auVar65._0_4_ * auVar97._0_4_ * auVar12._0_4_ * auVar247._0_4_;
  auVar206._4_4_ =
       auVar14._4_4_ * fVar183 + auVar65._4_4_ * auVar97._4_4_ * auVar12._4_4_ * auVar247._4_4_;
  auVar206._8_4_ =
       auVar14._8_4_ * fVar153 + auVar65._8_4_ * auVar97._8_4_ * auVar12._8_4_ * auVar247._8_4_;
  auVar206._12_4_ =
       auVar14._12_4_ * fVar224 + auVar65._12_4_ * auVar97._12_4_ * auVar12._12_4_ * auVar247._12_4_
  ;
  auVar14 = vsubps_avx(auVar98,auVar206);
  local_428._0_4_ = auVar248._0_4_ + (float)local_5c8._0_4_;
  local_428._4_4_ = auVar248._4_4_ + (float)local_5c8._4_4_;
  fStack_420 = auVar248._8_4_ + fStack_5c0;
  fStack_41c = auVar248._12_4_ + fStack_5bc;
  auVar247 = vshufps_avx(_local_5a8,_local_5a8,0xff);
  auVar130._0_4_ = fVar163 * auVar247._0_4_;
  auVar130._4_4_ = fVar225 * auVar247._4_4_;
  auVar130._8_4_ = fVar199 * auVar247._8_4_;
  auVar130._12_4_ = fVar164 * auVar247._12_4_;
  _local_438 = vsubps_avx(_local_5a8,auVar130);
  auVar12 = vshufps_avx(auVar63,auVar63,0xff);
  auVar99._0_4_ =
       fVar163 * auVar12._0_4_ + auVar247._0_4_ * auVar13._0_4_ * auVar64._0_4_ * auVar219._0_4_;
  auVar99._4_4_ =
       fVar225 * auVar12._4_4_ + auVar247._4_4_ * auVar13._4_4_ * auVar64._4_4_ * auVar219._4_4_;
  auVar99._8_4_ =
       fVar199 * auVar12._8_4_ + auVar247._8_4_ * auVar13._8_4_ * auVar64._8_4_ * auVar219._8_4_;
  auVar99._12_4_ =
       fVar164 * auVar12._12_4_ +
       auVar247._12_4_ * auVar13._12_4_ * auVar64._12_4_ * auVar219._12_4_;
  auVar13 = vsubps_avx(auVar63,auVar99);
  local_448._0_4_ = (float)local_5a8._0_4_ + auVar130._0_4_;
  local_448._4_4_ = (float)local_5a8._4_4_ + auVar130._4_4_;
  fStack_440 = fStack_5a0 + auVar130._8_4_;
  fStack_43c = fStack_59c + auVar130._12_4_;
  local_458._0_4_ = local_418._0_4_ + auVar14._0_4_ * 0.33333334;
  local_458._4_4_ = local_418._4_4_ + auVar14._4_4_ * 0.33333334;
  fStack_450 = local_418._8_4_ + auVar14._8_4_ * 0.33333334;
  fStack_44c = local_418._12_4_ + auVar14._12_4_ * 0.33333334;
  auVar65 = vsubps_avx(_local_418,auVar11);
  auVar247 = vmovsldup_avx(auVar65);
  auVar219 = vmovshdup_avx(auVar65);
  auVar12 = vshufps_avx(auVar65,auVar65,0xaa);
  fVar213 = (local_488->vx).field_0.m128[0];
  fVar183 = (local_488->vx).field_0.m128[1];
  fVar153 = (local_488->vx).field_0.m128[2];
  fVar224 = (local_488->vx).field_0.m128[3];
  fVar198 = (local_488->vy).field_0.m128[0];
  fVar163 = (local_488->vy).field_0.m128[1];
  fVar225 = (local_488->vy).field_0.m128[2];
  fVar199 = (local_488->vy).field_0.m128[3];
  fVar164 = (local_488->vz).field_0.m128[0];
  fVar226 = (local_488->vz).field_0.m128[1];
  fVar200 = (local_488->vz).field_0.m128[2];
  fVar165 = (local_488->vz).field_0.m128[3];
  fVar94 = fVar213 * auVar247._0_4_ + auVar12._0_4_ * fVar164 + fVar198 * auVar219._0_4_;
  fVar125 = fVar183 * auVar247._4_4_ + auVar12._4_4_ * fVar226 + fVar163 * auVar219._4_4_;
  local_5c8._4_4_ = fVar125;
  local_5c8._0_4_ = fVar94;
  fStack_5c0 = fVar153 * auVar247._8_4_ + auVar12._8_4_ * fVar200 + fVar225 * auVar219._8_4_;
  fStack_5bc = fVar224 * auVar247._12_4_ + auVar12._12_4_ * fVar165 + fVar199 * auVar219._12_4_;
  auVar98 = vsubps_avx(_local_458,auVar11);
  auVar12 = vshufps_avx(auVar98,auVar98,0xaa);
  auVar219 = vmovshdup_avx(auVar98);
  auVar247 = vmovsldup_avx(auVar98);
  fVar95 = auVar247._0_4_ * fVar213 + auVar219._0_4_ * fVar198 + fVar164 * auVar12._0_4_;
  fVar126 = auVar247._4_4_ * fVar183 + auVar219._4_4_ * fVar163 + fVar226 * auVar12._4_4_;
  p00.field_0.v[1] = fVar126;
  p00.field_0.v[0] = fVar95;
  p00.field_0.v[2] = auVar247._8_4_ * fVar153 + auVar219._8_4_ * fVar225 + fVar200 * auVar12._8_4_;
  p00.field_0.v[3] =
       auVar247._12_4_ * fVar224 + auVar219._12_4_ * fVar199 + fVar165 * auVar12._12_4_;
  auVar189._0_4_ = auVar13._0_4_ * 0.33333334;
  auVar189._4_4_ = auVar13._4_4_ * 0.33333334;
  auVar189._8_4_ = auVar13._8_4_ * 0.33333334;
  auVar189._12_4_ = auVar13._12_4_ * 0.33333334;
  _local_468 = vsubps_avx(_local_438,auVar189);
  auVar63 = vsubps_avx(_local_468,auVar11);
  auVar12 = vshufps_avx(auVar63,auVar63,0xaa);
  auVar219 = vmovshdup_avx(auVar63);
  auVar247 = vmovsldup_avx(auVar63);
  auVar289._0_4_ = auVar247._0_4_ * fVar213 + auVar219._0_4_ * fVar198 + fVar164 * auVar12._0_4_;
  auVar289._4_4_ = auVar247._4_4_ * fVar183 + auVar219._4_4_ * fVar163 + fVar226 * auVar12._4_4_;
  auVar289._8_4_ = auVar247._8_4_ * fVar153 + auVar219._8_4_ * fVar225 + fVar200 * auVar12._8_4_;
  auVar289._12_4_ = auVar247._12_4_ * fVar224 + auVar219._12_4_ * fVar199 + fVar165 * auVar12._12_4_
  ;
  auVar97 = vsubps_avx(_local_438,auVar11);
  auVar12 = vshufps_avx(auVar97,auVar97,0xaa);
  auVar219 = vmovshdup_avx(auVar97);
  auVar247 = vmovsldup_avx(auVar97);
  auVar285._0_4_ = auVar247._0_4_ * fVar213 + auVar219._0_4_ * fVar198 + auVar12._0_4_ * fVar164;
  auVar285._4_4_ = auVar247._4_4_ * fVar183 + auVar219._4_4_ * fVar163 + auVar12._4_4_ * fVar226;
  auVar285._8_4_ = auVar247._8_4_ * fVar153 + auVar219._8_4_ * fVar225 + auVar12._8_4_ * fVar200;
  auVar285._12_4_ = auVar247._12_4_ * fVar224 + auVar219._12_4_ * fVar199 + auVar12._12_4_ * fVar165
  ;
  auVar127 = vsubps_avx(_local_428,auVar11);
  auVar12 = vshufps_avx(auVar127,auVar127,0xaa);
  auVar219 = vmovshdup_avx(auVar127);
  auVar247 = vmovsldup_avx(auVar127);
  auVar274._0_4_ = auVar247._0_4_ * fVar213 + auVar219._0_4_ * fVar198 + auVar12._0_4_ * fVar164;
  auVar274._4_4_ = auVar247._4_4_ * fVar183 + auVar219._4_4_ * fVar163 + auVar12._4_4_ * fVar226;
  auVar274._8_4_ = auVar247._8_4_ * fVar153 + auVar219._8_4_ * fVar225 + auVar12._8_4_ * fVar200;
  auVar274._12_4_ = auVar247._12_4_ * fVar224 + auVar219._12_4_ * fVar199 + auVar12._12_4_ * fVar165
  ;
  local_478._0_4_ = (fVar89 + auVar206._0_4_) * 0.33333334 + (float)local_428._0_4_;
  local_478._4_4_ = (fVar90 + auVar206._4_4_) * 0.33333334 + (float)local_428._4_4_;
  fStack_470 = (fVar91 + auVar206._8_4_) * 0.33333334 + fStack_420;
  fStack_46c = (fVar92 + auVar206._12_4_) * 0.33333334 + fStack_41c;
  auVar96 = vsubps_avx(_local_478,auVar11);
  auVar12 = vshufps_avx(auVar96,auVar96,0xaa);
  auVar219 = vmovshdup_avx(auVar96);
  auVar247 = vmovsldup_avx(auVar96);
  auVar230._0_4_ = auVar247._0_4_ * fVar213 + auVar219._0_4_ * fVar198 + auVar12._0_4_ * fVar164;
  auVar230._4_4_ = auVar247._4_4_ * fVar183 + auVar219._4_4_ * fVar163 + auVar12._4_4_ * fVar226;
  auVar230._8_4_ = auVar247._8_4_ * fVar153 + auVar219._8_4_ * fVar225 + auVar12._8_4_ * fVar200;
  auVar230._12_4_ = auVar247._12_4_ * fVar224 + auVar219._12_4_ * fVar199 + auVar12._12_4_ * fVar165
  ;
  auVar220._0_4_ = (fVar93 + auVar99._0_4_) * 0.33333334;
  auVar220._4_4_ = (fVar166 + auVar99._4_4_) * 0.33333334;
  auVar220._8_4_ = (fVar201 + auVar99._8_4_) * 0.33333334;
  auVar220._12_4_ = (fVar182 + auVar99._12_4_) * 0.33333334;
  auVar128 = vsubps_avx(_local_448,auVar220);
  auVar154 = vsubps_avx(auVar128,auVar11);
  auVar12 = vshufps_avx(auVar154,auVar154,0xaa);
  auVar219 = vmovshdup_avx(auVar154);
  auVar247 = vmovsldup_avx(auVar154);
  auVar100._0_4_ = auVar247._0_4_ * fVar213 + auVar219._0_4_ * fVar198 + fVar164 * auVar12._0_4_;
  auVar100._4_4_ = auVar247._4_4_ * fVar183 + auVar219._4_4_ * fVar163 + fVar226 * auVar12._4_4_;
  auVar100._8_4_ = auVar247._8_4_ * fVar153 + auVar219._8_4_ * fVar225 + fVar200 * auVar12._8_4_;
  auVar100._12_4_ = auVar247._12_4_ * fVar224 + auVar219._12_4_ * fVar199 + fVar165 * auVar12._12_4_
  ;
  auVar155 = vsubps_avx(_local_448,auVar11);
  auVar11 = vshufps_avx(auVar155,auVar155,0xaa);
  auVar219 = vmovshdup_avx(auVar155);
  auVar247 = vmovsldup_avx(auVar155);
  auVar66._0_4_ = fVar213 * auVar247._0_4_ + fVar198 * auVar219._0_4_ + fVar164 * auVar11._0_4_;
  auVar66._4_4_ = fVar183 * auVar247._4_4_ + fVar163 * auVar219._4_4_ + fVar226 * auVar11._4_4_;
  auVar66._8_4_ = fVar153 * auVar247._8_4_ + fVar225 * auVar219._8_4_ + fVar200 * auVar11._8_4_;
  auVar66._12_4_ = fVar224 * auVar247._12_4_ + fVar199 * auVar219._12_4_ + fVar165 * auVar11._12_4_;
  auVar12 = vmovlhps_avx(_local_5c8,auVar274);
  auVar13 = vmovlhps_avx((undefined1  [16])p00.field_0,auVar230);
  auVar14 = vmovlhps_avx(auVar289,auVar100);
  auVar64 = vmovlhps_avx(auVar285,auVar66);
  auVar219 = vminps_avx(auVar12,auVar13);
  auVar247 = vminps_avx(auVar14,auVar64);
  auVar11 = vminps_avx(auVar219,auVar247);
  auVar219 = vmaxps_avx(auVar12,auVar13);
  auVar247 = vmaxps_avx(auVar14,auVar64);
  auVar219 = vmaxps_avx(auVar219,auVar247);
  auVar247 = vshufpd_avx(auVar11,auVar11,3);
  auVar11 = vminps_avx(auVar11,auVar247);
  auVar247 = vshufpd_avx(auVar219,auVar219,3);
  auVar247 = vmaxps_avx(auVar219,auVar247);
  auVar207._8_4_ = 0x7fffffff;
  auVar207._0_8_ = 0x7fffffff7fffffff;
  auVar207._12_4_ = 0x7fffffff;
  auVar219 = vandps_avx(auVar11,auVar207);
  auVar247 = vandps_avx(auVar247,auVar207);
  auVar219 = vmaxps_avx(auVar219,auVar247);
  auVar247 = vmovshdup_avx(auVar219);
  auVar219 = vmaxss_avx(auVar247,auVar219);
  fVar183 = auVar219._0_4_ * 9.536743e-07;
  auVar219 = vshufps_avx(ZEXT416((uint)fVar183),ZEXT416((uint)fVar183),0);
  local_78._16_16_ = auVar219;
  local_78._0_16_ = auVar219;
  auVar67._0_8_ = auVar219._0_8_ ^ 0x8000000080000000;
  auVar67._8_4_ = auVar219._8_4_ ^ 0x80000000;
  auVar67._12_4_ = auVar219._12_4_ ^ 0x80000000;
  local_98._16_16_ = auVar67;
  local_98._0_16_ = auVar67;
  auVar219 = vpshufd_avx(ZEXT416(uVar55),0);
  auVar247 = vpshufd_avx(ZEXT416(*(uint *)(prim + lVar56 * 4 + 6)),0);
  bVar60 = false;
  uVar59 = 0;
  fVar213 = *(float *)(ray + k * 4 + 0x30);
  auVar11 = vsubps_avx(auVar13,auVar12);
  auVar156 = vsubps_avx(auVar14,auVar13);
  auVar167 = vsubps_avx(auVar64,auVar14);
  auVar168 = vsubps_avx(_local_428,_local_418);
  auVar184 = vsubps_avx(_local_478,_local_458);
  auVar202 = vsubps_avx(auVar128,_local_468);
  auVar203 = vsubps_avx(_local_448,_local_438);
  auVar295 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar297 = ZEXT1664(ZEXT816(0x3f80000000000000));
LAB_007cf576:
  do {
    auVar169 = auVar297._0_16_;
    auVar130 = auVar295._0_16_;
    auVar71 = vshufps_avx(auVar130,auVar130,0x50);
    auVar290._8_4_ = 0x3f800000;
    auVar290._0_8_ = 0x3f8000003f800000;
    auVar290._12_4_ = 0x3f800000;
    auVar294._16_4_ = 0x3f800000;
    auVar294._0_16_ = auVar290;
    auVar294._20_4_ = 0x3f800000;
    auVar294._24_4_ = 0x3f800000;
    auVar294._28_4_ = 0x3f800000;
    auVar214 = vsubps_avx(auVar290,auVar71);
    fVar153 = auVar71._0_4_;
    fVar224 = auVar71._4_4_;
    fVar198 = auVar71._8_4_;
    fVar163 = auVar71._12_4_;
    fVar225 = auVar214._0_4_;
    fVar199 = auVar214._4_4_;
    fVar164 = auVar214._8_4_;
    fVar226 = auVar214._12_4_;
    auVar158._0_4_ = auVar274._0_4_ * fVar153 + fVar225 * fVar94;
    auVar158._4_4_ = auVar274._4_4_ * fVar224 + fVar199 * fVar125;
    auVar158._8_4_ = auVar274._0_4_ * fVar198 + fVar164 * fVar94;
    auVar158._12_4_ = auVar274._4_4_ * fVar163 + fVar226 * fVar125;
    auVar131._0_4_ = auVar230._0_4_ * fVar153 + fVar225 * fVar95;
    auVar131._4_4_ = auVar230._4_4_ * fVar224 + fVar199 * fVar126;
    auVar131._8_4_ = auVar230._0_4_ * fVar198 + fVar164 * fVar95;
    auVar131._12_4_ = auVar230._4_4_ * fVar163 + fVar226 * fVar126;
    auVar221._0_4_ = auVar100._0_4_ * fVar153 + auVar289._0_4_ * fVar225;
    auVar221._4_4_ = auVar100._4_4_ * fVar224 + auVar289._4_4_ * fVar199;
    auVar221._8_4_ = auVar100._0_4_ * fVar198 + auVar289._0_4_ * fVar164;
    auVar221._12_4_ = auVar100._4_4_ * fVar163 + auVar289._4_4_ * fVar226;
    auVar170._0_4_ = auVar66._0_4_ * fVar153 + auVar285._0_4_ * fVar225;
    auVar170._4_4_ = auVar66._4_4_ * fVar224 + auVar285._4_4_ * fVar199;
    auVar170._8_4_ = auVar66._0_4_ * fVar198 + auVar285._0_4_ * fVar164;
    auVar170._12_4_ = auVar66._4_4_ * fVar163 + auVar285._4_4_ * fVar226;
    auVar71 = vmovshdup_avx(auVar169);
    auVar214 = vshufps_avx(auVar169,auVar169,0);
    auVar251._16_16_ = auVar214;
    auVar251._0_16_ = auVar214;
    auVar148 = vshufps_avx(auVar169,auVar169,0x55);
    auVar84._16_16_ = auVar148;
    auVar84._0_16_ = auVar148;
    auVar83 = vsubps_avx(auVar84,auVar251);
    auVar148 = vshufps_avx(auVar158,auVar158,0);
    auVar115 = vshufps_avx(auVar158,auVar158,0x55);
    auVar103 = vshufps_avx(auVar131,auVar131,0);
    auVar134 = vshufps_avx(auVar131,auVar131,0x55);
    auVar104 = vshufps_avx(auVar221,auVar221,0);
    auVar67 = vshufps_avx(auVar221,auVar221,0x55);
    auVar99 = vshufps_avx(auVar170,auVar170,0);
    auVar129 = vshufps_avx(auVar170,auVar170,0x55);
    auVar71 = ZEXT416((uint)((auVar71._0_4_ - auVar297._0_4_) * 0.04761905));
    auVar71 = vshufps_avx(auVar71,auVar71,0);
    auVar264._0_4_ = auVar214._0_4_ + auVar83._0_4_ * 0.0;
    auVar264._4_4_ = auVar214._4_4_ + auVar83._4_4_ * 0.14285715;
    auVar264._8_4_ = auVar214._8_4_ + auVar83._8_4_ * 0.2857143;
    auVar264._12_4_ = auVar214._12_4_ + auVar83._12_4_ * 0.42857146;
    auVar264._16_4_ = auVar214._0_4_ + auVar83._16_4_ * 0.5714286;
    auVar264._20_4_ = auVar214._4_4_ + auVar83._20_4_ * 0.71428573;
    auVar264._24_4_ = auVar214._8_4_ + auVar83._24_4_ * 0.8571429;
    auVar264._28_4_ = auVar214._12_4_ + auVar83._28_4_;
    auVar15 = vsubps_avx(auVar294,auVar264);
    fVar153 = auVar103._0_4_;
    fVar198 = auVar103._4_4_;
    fVar225 = auVar103._8_4_;
    fVar164 = auVar103._12_4_;
    fVar242 = auVar15._0_4_;
    fVar253 = auVar15._4_4_;
    fVar254 = auVar15._8_4_;
    fVar255 = auVar15._12_4_;
    fVar256 = auVar15._16_4_;
    fVar257 = auVar15._20_4_;
    fVar258 = auVar15._24_4_;
    fVar238 = auVar134._0_4_;
    fVar239 = auVar134._4_4_;
    fVar240 = auVar134._8_4_;
    fVar241 = auVar134._12_4_;
    fVar287 = auVar115._12_4_ + 1.0;
    fVar201 = auVar104._0_4_;
    fVar182 = auVar104._4_4_;
    fVar227 = auVar104._8_4_;
    fVar237 = auVar104._12_4_;
    fVar200 = fVar201 * auVar264._0_4_ + fVar242 * fVar153;
    fVar165 = fVar182 * auVar264._4_4_ + fVar253 * fVar198;
    fVar89 = fVar227 * auVar264._8_4_ + fVar254 * fVar225;
    fVar90 = fVar237 * auVar264._12_4_ + fVar255 * fVar164;
    fVar91 = fVar201 * auVar264._16_4_ + fVar256 * fVar153;
    fVar92 = fVar182 * auVar264._20_4_ + fVar257 * fVar198;
    fVar93 = fVar227 * auVar264._24_4_ + fVar258 * fVar225;
    fVar224 = auVar67._0_4_;
    fVar163 = auVar67._4_4_;
    fVar199 = auVar67._8_4_;
    fVar226 = auVar67._12_4_;
    fVar272 = fVar238 * fVar242 + auVar264._0_4_ * fVar224;
    fVar276 = fVar239 * fVar253 + auVar264._4_4_ * fVar163;
    fVar277 = fVar240 * fVar254 + auVar264._8_4_ * fVar199;
    fVar278 = fVar241 * fVar255 + auVar264._12_4_ * fVar226;
    fVar279 = fVar238 * fVar256 + auVar264._16_4_ * fVar224;
    fVar280 = fVar239 * fVar257 + auVar264._20_4_ * fVar163;
    fVar281 = fVar240 * fVar258 + auVar264._24_4_ * fVar199;
    fVar282 = fVar241 + fVar164;
    auVar214 = vshufps_avx(auVar158,auVar158,0xaa);
    auVar103 = vshufps_avx(auVar158,auVar158,0xff);
    fVar166 = fVar237 + 0.0;
    auVar134 = vshufps_avx(auVar131,auVar131,0xaa);
    auVar104 = vshufps_avx(auVar131,auVar131,0xff);
    auVar180._0_4_ =
         fVar242 * (auVar264._0_4_ * fVar153 + fVar242 * auVar148._0_4_) + auVar264._0_4_ * fVar200;
    auVar180._4_4_ =
         fVar253 * (auVar264._4_4_ * fVar198 + fVar253 * auVar148._4_4_) + auVar264._4_4_ * fVar165;
    auVar180._8_4_ =
         fVar254 * (auVar264._8_4_ * fVar225 + fVar254 * auVar148._8_4_) + auVar264._8_4_ * fVar89;
    auVar180._12_4_ =
         fVar255 * (auVar264._12_4_ * fVar164 + fVar255 * auVar148._12_4_) +
         auVar264._12_4_ * fVar90;
    auVar180._16_4_ =
         fVar256 * (auVar264._16_4_ * fVar153 + fVar256 * auVar148._0_4_) + auVar264._16_4_ * fVar91
    ;
    auVar180._20_4_ =
         fVar257 * (auVar264._20_4_ * fVar198 + fVar257 * auVar148._4_4_) + auVar264._20_4_ * fVar92
    ;
    auVar180._24_4_ =
         fVar258 * (auVar264._24_4_ * fVar225 + fVar258 * auVar148._8_4_) + auVar264._24_4_ * fVar93
    ;
    auVar180._28_4_ = auVar148._12_4_ + 1.0 + fVar226;
    auVar196._0_4_ =
         fVar242 * (fVar238 * auVar264._0_4_ + auVar115._0_4_ * fVar242) + auVar264._0_4_ * fVar272;
    auVar196._4_4_ =
         fVar253 * (fVar239 * auVar264._4_4_ + auVar115._4_4_ * fVar253) + auVar264._4_4_ * fVar276;
    auVar196._8_4_ =
         fVar254 * (fVar240 * auVar264._8_4_ + auVar115._8_4_ * fVar254) + auVar264._8_4_ * fVar277;
    auVar196._12_4_ =
         fVar255 * (fVar241 * auVar264._12_4_ + auVar115._12_4_ * fVar255) +
         auVar264._12_4_ * fVar278;
    auVar196._16_4_ =
         fVar256 * (fVar238 * auVar264._16_4_ + auVar115._0_4_ * fVar256) +
         auVar264._16_4_ * fVar279;
    auVar196._20_4_ =
         fVar257 * (fVar239 * auVar264._20_4_ + auVar115._4_4_ * fVar257) +
         auVar264._20_4_ * fVar280;
    auVar196._24_4_ =
         fVar258 * (fVar240 * auVar264._24_4_ + auVar115._8_4_ * fVar258) +
         auVar264._24_4_ * fVar281;
    auVar196._28_4_ = auVar129._12_4_ + fVar226;
    auVar85._0_4_ =
         fVar242 * fVar200 + auVar264._0_4_ * (fVar201 * fVar242 + auVar99._0_4_ * auVar264._0_4_);
    auVar85._4_4_ =
         fVar253 * fVar165 + auVar264._4_4_ * (fVar182 * fVar253 + auVar99._4_4_ * auVar264._4_4_);
    auVar85._8_4_ =
         fVar254 * fVar89 + auVar264._8_4_ * (fVar227 * fVar254 + auVar99._8_4_ * auVar264._8_4_);
    auVar85._12_4_ =
         fVar255 * fVar90 + auVar264._12_4_ * (fVar237 * fVar255 + auVar99._12_4_ * auVar264._12_4_)
    ;
    auVar85._16_4_ =
         fVar256 * fVar91 + auVar264._16_4_ * (fVar201 * fVar256 + auVar99._0_4_ * auVar264._16_4_);
    auVar85._20_4_ =
         fVar257 * fVar92 + auVar264._20_4_ * (fVar182 * fVar257 + auVar99._4_4_ * auVar264._20_4_);
    auVar85._24_4_ =
         fVar258 * fVar93 + auVar264._24_4_ * (fVar227 * fVar258 + auVar99._8_4_ * auVar264._24_4_);
    auVar85._28_4_ = fVar164 + 1.0 + fVar166;
    auVar271._0_4_ =
         fVar242 * fVar272 + auVar264._0_4_ * (auVar129._0_4_ * auVar264._0_4_ + fVar242 * fVar224);
    auVar271._4_4_ =
         fVar253 * fVar276 + auVar264._4_4_ * (auVar129._4_4_ * auVar264._4_4_ + fVar253 * fVar163);
    auVar271._8_4_ =
         fVar254 * fVar277 + auVar264._8_4_ * (auVar129._8_4_ * auVar264._8_4_ + fVar254 * fVar199);
    auVar271._12_4_ =
         fVar255 * fVar278 +
         auVar264._12_4_ * (auVar129._12_4_ * auVar264._12_4_ + fVar255 * fVar226);
    auVar271._16_4_ =
         fVar256 * fVar279 +
         auVar264._16_4_ * (auVar129._0_4_ * auVar264._16_4_ + fVar256 * fVar224);
    auVar271._20_4_ =
         fVar257 * fVar280 +
         auVar264._20_4_ * (auVar129._4_4_ * auVar264._20_4_ + fVar257 * fVar163);
    auVar271._24_4_ =
         fVar258 * fVar281 +
         auVar264._24_4_ * (auVar129._8_4_ * auVar264._24_4_ + fVar258 * fVar199);
    auVar271._28_4_ = fVar166 + fVar226 + 0.0;
    local_d8._0_4_ = fVar242 * auVar180._0_4_ + auVar264._0_4_ * auVar85._0_4_;
    local_d8._4_4_ = fVar253 * auVar180._4_4_ + auVar264._4_4_ * auVar85._4_4_;
    local_d8._8_4_ = fVar254 * auVar180._8_4_ + auVar264._8_4_ * auVar85._8_4_;
    local_d8._12_4_ = fVar255 * auVar180._12_4_ + auVar264._12_4_ * auVar85._12_4_;
    local_d8._16_4_ = fVar256 * auVar180._16_4_ + auVar264._16_4_ * auVar85._16_4_;
    local_d8._20_4_ = fVar257 * auVar180._20_4_ + auVar264._20_4_ * auVar85._20_4_;
    local_d8._24_4_ = fVar258 * auVar180._24_4_ + auVar264._24_4_ * auVar85._24_4_;
    local_d8._28_4_ = fVar282 + fVar226 + 0.0;
    auVar162._0_4_ = fVar242 * auVar196._0_4_ + auVar264._0_4_ * auVar271._0_4_;
    auVar162._4_4_ = fVar253 * auVar196._4_4_ + auVar264._4_4_ * auVar271._4_4_;
    auVar162._8_4_ = fVar254 * auVar196._8_4_ + auVar264._8_4_ * auVar271._8_4_;
    auVar162._12_4_ = fVar255 * auVar196._12_4_ + auVar264._12_4_ * auVar271._12_4_;
    auVar162._16_4_ = fVar256 * auVar196._16_4_ + auVar264._16_4_ * auVar271._16_4_;
    auVar162._20_4_ = fVar257 * auVar196._20_4_ + auVar264._20_4_ * auVar271._20_4_;
    auVar162._24_4_ = fVar258 * auVar196._24_4_ + auVar264._24_4_ * auVar271._24_4_;
    auVar162._28_4_ = fVar282 + fVar166;
    auVar16 = vsubps_avx(auVar85,auVar180);
    auVar83 = vsubps_avx(auVar271,auVar196);
    local_4e8 = auVar71._0_4_;
    fStack_4e4 = auVar71._4_4_;
    fStack_4e0 = auVar71._8_4_;
    fStack_4dc = auVar71._12_4_;
    local_118 = local_4e8 * auVar16._0_4_ * 3.0;
    fStack_114 = fStack_4e4 * auVar16._4_4_ * 3.0;
    auVar17._4_4_ = fStack_114;
    auVar17._0_4_ = local_118;
    fStack_110 = fStack_4e0 * auVar16._8_4_ * 3.0;
    auVar17._8_4_ = fStack_110;
    fStack_10c = fStack_4dc * auVar16._12_4_ * 3.0;
    auVar17._12_4_ = fStack_10c;
    fStack_108 = local_4e8 * auVar16._16_4_ * 3.0;
    auVar17._16_4_ = fStack_108;
    fStack_104 = fStack_4e4 * auVar16._20_4_ * 3.0;
    auVar17._20_4_ = fStack_104;
    fStack_100 = fStack_4e0 * auVar16._24_4_ * 3.0;
    auVar17._24_4_ = fStack_100;
    auVar17._28_4_ = auVar16._28_4_;
    local_138 = local_4e8 * auVar83._0_4_ * 3.0;
    fStack_134 = fStack_4e4 * auVar83._4_4_ * 3.0;
    auVar18._4_4_ = fStack_134;
    auVar18._0_4_ = local_138;
    fStack_130 = fStack_4e0 * auVar83._8_4_ * 3.0;
    auVar18._8_4_ = fStack_130;
    fStack_12c = fStack_4dc * auVar83._12_4_ * 3.0;
    auVar18._12_4_ = fStack_12c;
    fStack_128 = local_4e8 * auVar83._16_4_ * 3.0;
    auVar18._16_4_ = fStack_128;
    fStack_124 = fStack_4e4 * auVar83._20_4_ * 3.0;
    auVar18._20_4_ = fStack_124;
    fStack_120 = fStack_4e0 * auVar83._24_4_ * 3.0;
    auVar18._24_4_ = fStack_120;
    auVar18._28_4_ = fVar282;
    auVar17 = vsubps_avx(local_d8,auVar17);
    auVar83 = vperm2f128_avx(auVar17,auVar17,1);
    auVar83 = vshufps_avx(auVar83,auVar17,0x30);
    auVar83 = vshufps_avx(auVar17,auVar83,0x29);
    auVar18 = vsubps_avx(auVar162,auVar18);
    auVar17 = vperm2f128_avx(auVar18,auVar18,1);
    auVar17 = vshufps_avx(auVar17,auVar18,0x30);
    auVar18 = vshufps_avx(auVar18,auVar17,0x29);
    fVar280 = auVar134._0_4_;
    fVar281 = auVar134._4_4_;
    fVar298 = auVar134._8_4_;
    fVar164 = auVar214._12_4_;
    fVar182 = auVar104._0_4_;
    fVar237 = auVar104._4_4_;
    fVar272 = auVar104._8_4_;
    fVar276 = auVar104._12_4_;
    auVar71 = vshufps_avx(auVar221,auVar221,0xaa);
    fVar153 = auVar71._0_4_;
    fVar198 = auVar71._4_4_;
    fVar225 = auVar71._8_4_;
    fVar226 = auVar71._12_4_;
    fVar89 = auVar264._0_4_ * fVar153 + fVar280 * fVar242;
    fVar90 = auVar264._4_4_ * fVar198 + fVar281 * fVar253;
    fVar91 = auVar264._8_4_ * fVar225 + fVar298 * fVar254;
    fVar92 = auVar264._12_4_ * fVar226 + auVar134._12_4_ * fVar255;
    fVar93 = auVar264._16_4_ * fVar153 + fVar280 * fVar256;
    fVar166 = auVar264._20_4_ * fVar198 + fVar281 * fVar257;
    fVar201 = auVar264._24_4_ * fVar225 + fVar298 * fVar258;
    auVar71 = vshufps_avx(auVar221,auVar221,0xff);
    fVar224 = auVar71._0_4_;
    fVar163 = auVar71._4_4_;
    fVar199 = auVar71._8_4_;
    fVar200 = auVar71._12_4_;
    fVar227 = auVar264._0_4_ * fVar224 + fVar182 * fVar242;
    fVar238 = auVar264._4_4_ * fVar163 + fVar237 * fVar253;
    fVar239 = auVar264._8_4_ * fVar199 + fVar272 * fVar254;
    fVar240 = auVar264._12_4_ * fVar200 + fVar276 * fVar255;
    fVar277 = auVar264._16_4_ * fVar224 + fVar182 * fVar256;
    fVar241 = auVar264._20_4_ * fVar163 + fVar237 * fVar257;
    fVar278 = auVar264._24_4_ * fVar199 + fVar272 * fVar258;
    auVar71 = vshufps_avx(auVar170,auVar170,0xaa);
    fVar279 = auVar71._12_4_ + fVar226;
    auVar148 = vshufps_avx(auVar170,auVar170,0xff);
    fVar165 = auVar148._12_4_;
    auVar86._0_4_ =
         fVar242 * (fVar280 * auVar264._0_4_ + fVar242 * auVar214._0_4_) + auVar264._0_4_ * fVar89;
    auVar86._4_4_ =
         fVar253 * (fVar281 * auVar264._4_4_ + fVar253 * auVar214._4_4_) + auVar264._4_4_ * fVar90;
    auVar86._8_4_ =
         fVar254 * (fVar298 * auVar264._8_4_ + fVar254 * auVar214._8_4_) + auVar264._8_4_ * fVar91;
    auVar86._12_4_ =
         fVar255 * (auVar134._12_4_ * auVar264._12_4_ + fVar255 * fVar164) +
         auVar264._12_4_ * fVar92;
    auVar86._16_4_ =
         fVar256 * (fVar280 * auVar264._16_4_ + fVar256 * auVar214._0_4_) + auVar264._16_4_ * fVar93
    ;
    auVar86._20_4_ =
         fVar257 * (fVar281 * auVar264._20_4_ + fVar257 * auVar214._4_4_) +
         auVar264._20_4_ * fVar166;
    auVar86._24_4_ =
         fVar258 * (fVar298 * auVar264._24_4_ + fVar258 * auVar214._8_4_) +
         auVar264._24_4_ * fVar201;
    auVar86._28_4_ = auVar18._28_4_ + fVar164 + fVar165;
    auVar121._0_4_ =
         fVar242 * (fVar182 * auVar264._0_4_ + auVar103._0_4_ * fVar242) + auVar264._0_4_ * fVar227;
    auVar121._4_4_ =
         fVar253 * (fVar237 * auVar264._4_4_ + auVar103._4_4_ * fVar253) + auVar264._4_4_ * fVar238;
    auVar121._8_4_ =
         fVar254 * (fVar272 * auVar264._8_4_ + auVar103._8_4_ * fVar254) + auVar264._8_4_ * fVar239;
    auVar121._12_4_ =
         fVar255 * (fVar276 * auVar264._12_4_ + auVar103._12_4_ * fVar255) +
         auVar264._12_4_ * fVar240;
    auVar121._16_4_ =
         fVar256 * (fVar182 * auVar264._16_4_ + auVar103._0_4_ * fVar256) +
         auVar264._16_4_ * fVar277;
    auVar121._20_4_ =
         fVar257 * (fVar237 * auVar264._20_4_ + auVar103._4_4_ * fVar257) +
         auVar264._20_4_ * fVar241;
    auVar121._24_4_ =
         fVar258 * (fVar272 * auVar264._24_4_ + auVar103._8_4_ * fVar258) +
         auVar264._24_4_ * fVar278;
    auVar121._28_4_ = fVar164 + auVar17._28_4_ + fVar165;
    auVar17 = vperm2f128_avx(local_d8,local_d8,1);
    auVar17 = vshufps_avx(auVar17,local_d8,0x30);
    _local_408 = vshufps_avx(local_d8,auVar17,0x29);
    auVar197._0_4_ =
         auVar264._0_4_ * (auVar71._0_4_ * auVar264._0_4_ + fVar242 * fVar153) + fVar242 * fVar89;
    auVar197._4_4_ =
         auVar264._4_4_ * (auVar71._4_4_ * auVar264._4_4_ + fVar253 * fVar198) + fVar253 * fVar90;
    auVar197._8_4_ =
         auVar264._8_4_ * (auVar71._8_4_ * auVar264._8_4_ + fVar254 * fVar225) + fVar254 * fVar91;
    auVar197._12_4_ =
         auVar264._12_4_ * (auVar71._12_4_ * auVar264._12_4_ + fVar255 * fVar226) + fVar255 * fVar92
    ;
    auVar197._16_4_ =
         auVar264._16_4_ * (auVar71._0_4_ * auVar264._16_4_ + fVar256 * fVar153) + fVar256 * fVar93;
    auVar197._20_4_ =
         auVar264._20_4_ * (auVar71._4_4_ * auVar264._20_4_ + fVar257 * fVar198) + fVar257 * fVar166
    ;
    auVar197._24_4_ =
         auVar264._24_4_ * (auVar71._8_4_ * auVar264._24_4_ + fVar258 * fVar225) + fVar258 * fVar201
    ;
    auVar197._28_4_ = fVar279 + fVar287 + auVar196._28_4_;
    auVar236._0_4_ =
         fVar242 * fVar227 + auVar264._0_4_ * (auVar264._0_4_ * auVar148._0_4_ + fVar242 * fVar224);
    auVar236._4_4_ =
         fVar253 * fVar238 + auVar264._4_4_ * (auVar264._4_4_ * auVar148._4_4_ + fVar253 * fVar163);
    auVar236._8_4_ =
         fVar254 * fVar239 + auVar264._8_4_ * (auVar264._8_4_ * auVar148._8_4_ + fVar254 * fVar199);
    auVar236._12_4_ =
         fVar255 * fVar240 + auVar264._12_4_ * (auVar264._12_4_ * fVar165 + fVar255 * fVar200);
    auVar236._16_4_ =
         fVar256 * fVar277 +
         auVar264._16_4_ * (auVar264._16_4_ * auVar148._0_4_ + fVar256 * fVar224);
    auVar236._20_4_ =
         fVar257 * fVar241 +
         auVar264._20_4_ * (auVar264._20_4_ * auVar148._4_4_ + fVar257 * fVar163);
    auVar236._24_4_ =
         fVar258 * fVar278 +
         auVar264._24_4_ * (auVar264._24_4_ * auVar148._8_4_ + fVar258 * fVar199);
    auVar236._28_4_ = fVar287 + fVar276 + fVar165 + fVar200;
    auVar223._0_4_ = fVar242 * auVar86._0_4_ + auVar264._0_4_ * auVar197._0_4_;
    auVar223._4_4_ = fVar253 * auVar86._4_4_ + auVar264._4_4_ * auVar197._4_4_;
    auVar223._8_4_ = fVar254 * auVar86._8_4_ + auVar264._8_4_ * auVar197._8_4_;
    auVar223._12_4_ = fVar255 * auVar86._12_4_ + auVar264._12_4_ * auVar197._12_4_;
    auVar223._16_4_ = fVar256 * auVar86._16_4_ + auVar264._16_4_ * auVar197._16_4_;
    auVar223._20_4_ = fVar257 * auVar86._20_4_ + auVar264._20_4_ * auVar197._20_4_;
    auVar223._24_4_ = fVar258 * auVar86._24_4_ + auVar264._24_4_ * auVar197._24_4_;
    auVar223._28_4_ = fVar279 + fVar165 + fVar200;
    auVar252._0_4_ = fVar242 * auVar121._0_4_ + auVar264._0_4_ * auVar236._0_4_;
    auVar252._4_4_ = fVar253 * auVar121._4_4_ + auVar264._4_4_ * auVar236._4_4_;
    auVar252._8_4_ = fVar254 * auVar121._8_4_ + auVar264._8_4_ * auVar236._8_4_;
    auVar252._12_4_ = fVar255 * auVar121._12_4_ + auVar264._12_4_ * auVar236._12_4_;
    auVar252._16_4_ = fVar256 * auVar121._16_4_ + auVar264._16_4_ * auVar236._16_4_;
    auVar252._20_4_ = fVar257 * auVar121._20_4_ + auVar264._20_4_ * auVar236._20_4_;
    auVar252._24_4_ = fVar258 * auVar121._24_4_ + auVar264._24_4_ * auVar236._24_4_;
    auVar252._28_4_ = auVar15._28_4_ + auVar264._28_4_;
    auVar19 = vsubps_avx(auVar197,auVar86);
    auVar17 = vsubps_avx(auVar236,auVar121);
    local_158 = local_4e8 * auVar19._0_4_ * 3.0;
    fStack_154 = fStack_4e4 * auVar19._4_4_ * 3.0;
    auVar15._4_4_ = fStack_154;
    auVar15._0_4_ = local_158;
    fStack_150 = fStack_4e0 * auVar19._8_4_ * 3.0;
    auVar15._8_4_ = fStack_150;
    fStack_14c = fStack_4dc * auVar19._12_4_ * 3.0;
    auVar15._12_4_ = fStack_14c;
    fStack_148 = local_4e8 * auVar19._16_4_ * 3.0;
    auVar15._16_4_ = fStack_148;
    fStack_144 = fStack_4e4 * auVar19._20_4_ * 3.0;
    auVar15._20_4_ = fStack_144;
    fStack_140 = fStack_4e0 * auVar19._24_4_ * 3.0;
    auVar15._24_4_ = fStack_140;
    auVar15._28_4_ = auVar19._28_4_;
    local_178 = local_4e8 * auVar17._0_4_ * 3.0;
    fStack_174 = fStack_4e4 * auVar17._4_4_ * 3.0;
    auVar20._4_4_ = fStack_174;
    auVar20._0_4_ = local_178;
    fStack_170 = fStack_4e0 * auVar17._8_4_ * 3.0;
    auVar20._8_4_ = fStack_170;
    fStack_16c = fStack_4dc * auVar17._12_4_ * 3.0;
    auVar20._12_4_ = fStack_16c;
    fStack_168 = local_4e8 * auVar17._16_4_ * 3.0;
    auVar20._16_4_ = fStack_168;
    fStack_164 = fStack_4e4 * auVar17._20_4_ * 3.0;
    auVar20._20_4_ = fStack_164;
    fStack_160 = fStack_4e0 * auVar17._24_4_ * 3.0;
    auVar20._24_4_ = fStack_160;
    auVar20._28_4_ = auVar197._28_4_;
    auVar17 = vperm2f128_avx(auVar223,auVar223,1);
    auVar17 = vshufps_avx(auVar17,auVar223,0x30);
    auVar84 = vshufps_avx(auVar223,auVar17,0x29);
    auVar15 = vsubps_avx(auVar223,auVar15);
    auVar17 = vperm2f128_avx(auVar15,auVar15,1);
    auVar17 = vshufps_avx(auVar17,auVar15,0x30);
    auVar17 = vshufps_avx(auVar15,auVar17,0x29);
    auVar20 = vsubps_avx(auVar252,auVar20);
    auVar15 = vperm2f128_avx(auVar20,auVar20,1);
    auVar15 = vshufps_avx(auVar15,auVar20,0x30);
    local_b8 = vshufps_avx(auVar20,auVar15,0x29);
    auVar21 = vsubps_avx(auVar223,local_d8);
    auVar85 = vsubps_avx(auVar84,_local_408);
    fVar153 = auVar85._0_4_ + auVar21._0_4_;
    fVar224 = auVar85._4_4_ + auVar21._4_4_;
    fVar198 = auVar85._8_4_ + auVar21._8_4_;
    fVar163 = auVar85._12_4_ + auVar21._12_4_;
    fVar225 = auVar85._16_4_ + auVar21._16_4_;
    fVar199 = auVar85._20_4_ + auVar21._20_4_;
    fVar164 = auVar85._24_4_ + auVar21._24_4_;
    auVar15 = vperm2f128_avx(auVar162,auVar162,1);
    auVar15 = vshufps_avx(auVar15,auVar162,0x30);
    local_f8 = vshufps_avx(auVar162,auVar15,0x29);
    auVar15 = vperm2f128_avx(auVar252,auVar252,1);
    auVar15 = vshufps_avx(auVar15,auVar252,0x30);
    auVar20 = vshufps_avx(auVar252,auVar15,0x29);
    auVar15 = vsubps_avx(auVar252,auVar162);
    auVar86 = vsubps_avx(auVar20,local_f8);
    fVar226 = auVar86._0_4_ + auVar15._0_4_;
    fVar200 = auVar86._4_4_ + auVar15._4_4_;
    fVar165 = auVar86._8_4_ + auVar15._8_4_;
    fVar89 = auVar86._12_4_ + auVar15._12_4_;
    fVar90 = auVar86._16_4_ + auVar15._16_4_;
    fVar91 = auVar86._20_4_ + auVar15._20_4_;
    fVar92 = auVar86._24_4_ + auVar15._24_4_;
    auVar22._4_4_ = fVar224 * auVar162._4_4_;
    auVar22._0_4_ = fVar153 * auVar162._0_4_;
    auVar22._8_4_ = fVar198 * auVar162._8_4_;
    auVar22._12_4_ = fVar163 * auVar162._12_4_;
    auVar22._16_4_ = fVar225 * auVar162._16_4_;
    auVar22._20_4_ = fVar199 * auVar162._20_4_;
    auVar22._24_4_ = fVar164 * auVar162._24_4_;
    auVar22._28_4_ = auVar15._28_4_;
    auVar23._4_4_ = fVar200 * local_d8._4_4_;
    auVar23._0_4_ = fVar226 * local_d8._0_4_;
    auVar23._8_4_ = fVar165 * local_d8._8_4_;
    auVar23._12_4_ = fVar89 * local_d8._12_4_;
    auVar23._16_4_ = fVar90 * local_d8._16_4_;
    auVar23._20_4_ = fVar91 * local_d8._20_4_;
    auVar23._24_4_ = fVar92 * local_d8._24_4_;
    auVar23._28_4_ = fVar279;
    auVar22 = vsubps_avx(auVar22,auVar23);
    local_118 = local_d8._0_4_ + local_118;
    fStack_114 = local_d8._4_4_ + fStack_114;
    fStack_110 = local_d8._8_4_ + fStack_110;
    fStack_10c = local_d8._12_4_ + fStack_10c;
    fStack_108 = local_d8._16_4_ + fStack_108;
    fStack_104 = local_d8._20_4_ + fStack_104;
    fStack_100 = local_d8._24_4_ + fStack_100;
    fStack_fc = local_d8._28_4_ + auVar16._28_4_;
    local_138 = local_138 + auVar162._0_4_;
    fStack_134 = fStack_134 + auVar162._4_4_;
    fStack_130 = fStack_130 + auVar162._8_4_;
    fStack_12c = fStack_12c + auVar162._12_4_;
    fStack_128 = fStack_128 + auVar162._16_4_;
    fStack_124 = fStack_124 + auVar162._20_4_;
    fStack_120 = fStack_120 + auVar162._24_4_;
    fStack_11c = fVar282 + auVar162._28_4_;
    auVar16._4_4_ = fVar224 * fStack_134;
    auVar16._0_4_ = fVar153 * local_138;
    auVar16._8_4_ = fVar198 * fStack_130;
    auVar16._12_4_ = fVar163 * fStack_12c;
    auVar16._16_4_ = fVar225 * fStack_128;
    auVar16._20_4_ = fVar199 * fStack_124;
    auVar16._24_4_ = fVar164 * fStack_120;
    auVar16._28_4_ = fVar282;
    auVar24._4_4_ = fVar200 * fStack_114;
    auVar24._0_4_ = fVar226 * local_118;
    auVar24._8_4_ = fVar165 * fStack_110;
    auVar24._12_4_ = fVar89 * fStack_10c;
    auVar24._16_4_ = fVar90 * fStack_108;
    auVar24._20_4_ = fVar91 * fStack_104;
    auVar24._24_4_ = fVar92 * fStack_100;
    auVar24._28_4_ = fVar282 + auVar162._28_4_;
    auVar16 = vsubps_avx(auVar16,auVar24);
    local_5a8._0_4_ = auVar18._0_4_;
    local_5a8._4_4_ = auVar18._4_4_;
    fStack_5a0 = auVar18._8_4_;
    fStack_59c = auVar18._12_4_;
    fStack_598 = auVar18._16_4_;
    fStack_594 = auVar18._20_4_;
    fStack_590 = auVar18._24_4_;
    auVar25._4_4_ = fVar224 * (float)local_5a8._4_4_;
    auVar25._0_4_ = fVar153 * (float)local_5a8._0_4_;
    auVar25._8_4_ = fVar198 * fStack_5a0;
    auVar25._12_4_ = fVar163 * fStack_59c;
    auVar25._16_4_ = fVar225 * fStack_598;
    auVar25._20_4_ = fVar199 * fStack_594;
    auVar25._24_4_ = fVar164 * fStack_590;
    auVar25._28_4_ = fVar282;
    local_5c8._0_4_ = auVar83._0_4_;
    local_5c8._4_4_ = auVar83._4_4_;
    fStack_5c0 = auVar83._8_4_;
    fStack_5bc = auVar83._12_4_;
    fStack_5b8 = auVar83._16_4_;
    fStack_5b4 = auVar83._20_4_;
    fStack_5b0 = auVar83._24_4_;
    auVar26._4_4_ = fVar200 * (float)local_5c8._4_4_;
    auVar26._0_4_ = fVar226 * (float)local_5c8._0_4_;
    auVar26._8_4_ = fVar165 * fStack_5c0;
    auVar26._12_4_ = fVar89 * fStack_5bc;
    auVar26._16_4_ = fVar90 * fStack_5b8;
    auVar26._20_4_ = fVar91 * fStack_5b4;
    auVar26._24_4_ = fVar92 * fStack_5b0;
    auVar26._28_4_ = local_d8._28_4_;
    auVar23 = vsubps_avx(auVar25,auVar26);
    auVar27._4_4_ = local_f8._4_4_ * fVar224;
    auVar27._0_4_ = local_f8._0_4_ * fVar153;
    auVar27._8_4_ = local_f8._8_4_ * fVar198;
    auVar27._12_4_ = local_f8._12_4_ * fVar163;
    auVar27._16_4_ = local_f8._16_4_ * fVar225;
    auVar27._20_4_ = local_f8._20_4_ * fVar199;
    auVar27._24_4_ = local_f8._24_4_ * fVar164;
    auVar27._28_4_ = fVar282;
    auVar28._4_4_ = local_408._4_4_ * fVar200;
    auVar28._0_4_ = local_408._0_4_ * fVar226;
    auVar28._8_4_ = local_408._8_4_ * fVar165;
    auVar28._12_4_ = local_408._12_4_ * fVar89;
    auVar28._16_4_ = local_408._16_4_ * fVar90;
    auVar28._20_4_ = local_408._20_4_ * fVar91;
    auVar28._24_4_ = local_408._24_4_ * fVar92;
    auVar28._28_4_ = local_f8._28_4_;
    local_4e8 = auVar17._0_4_;
    fStack_4e4 = auVar17._4_4_;
    fStack_4e0 = auVar17._8_4_;
    fStack_4dc = auVar17._12_4_;
    fStack_4d8 = auVar17._16_4_;
    fStack_4d4 = auVar17._20_4_;
    fStack_4d0 = auVar17._24_4_;
    auVar24 = vsubps_avx(auVar27,auVar28);
    auVar29._4_4_ = auVar252._4_4_ * fVar224;
    auVar29._0_4_ = auVar252._0_4_ * fVar153;
    auVar29._8_4_ = auVar252._8_4_ * fVar198;
    auVar29._12_4_ = auVar252._12_4_ * fVar163;
    auVar29._16_4_ = auVar252._16_4_ * fVar225;
    auVar29._20_4_ = auVar252._20_4_ * fVar199;
    auVar29._24_4_ = auVar252._24_4_ * fVar164;
    auVar29._28_4_ = fVar282;
    auVar30._4_4_ = fVar200 * auVar223._4_4_;
    auVar30._0_4_ = fVar226 * auVar223._0_4_;
    auVar30._8_4_ = fVar165 * auVar223._8_4_;
    auVar30._12_4_ = fVar89 * auVar223._12_4_;
    auVar30._16_4_ = fVar90 * auVar223._16_4_;
    auVar30._20_4_ = fVar91 * auVar223._20_4_;
    auVar30._24_4_ = fVar92 * auVar223._24_4_;
    auVar30._28_4_ = fStack_fc;
    auVar25 = vsubps_avx(auVar29,auVar30);
    local_158 = auVar223._0_4_ + local_158;
    fStack_154 = auVar223._4_4_ + fStack_154;
    fStack_150 = auVar223._8_4_ + fStack_150;
    fStack_14c = auVar223._12_4_ + fStack_14c;
    fStack_148 = auVar223._16_4_ + fStack_148;
    fStack_144 = auVar223._20_4_ + fStack_144;
    fStack_140 = auVar223._24_4_ + fStack_140;
    fStack_13c = auVar223._28_4_ + auVar19._28_4_;
    local_178 = auVar252._0_4_ + local_178;
    fStack_174 = auVar252._4_4_ + fStack_174;
    fStack_170 = auVar252._8_4_ + fStack_170;
    fStack_16c = auVar252._12_4_ + fStack_16c;
    fStack_168 = auVar252._16_4_ + fStack_168;
    fStack_164 = auVar252._20_4_ + fStack_164;
    fStack_160 = auVar252._24_4_ + fStack_160;
    fStack_15c = auVar252._28_4_ + auVar197._28_4_;
    auVar19._4_4_ = fVar224 * fStack_174;
    auVar19._0_4_ = fVar153 * local_178;
    auVar19._8_4_ = fVar198 * fStack_170;
    auVar19._12_4_ = fVar163 * fStack_16c;
    auVar19._16_4_ = fVar225 * fStack_168;
    auVar19._20_4_ = fVar199 * fStack_164;
    auVar19._24_4_ = fVar164 * fStack_160;
    auVar19._28_4_ = auVar252._28_4_ + auVar197._28_4_;
    auVar31._4_4_ = fStack_154 * fVar200;
    auVar31._0_4_ = local_158 * fVar226;
    auVar31._8_4_ = fStack_150 * fVar165;
    auVar31._12_4_ = fStack_14c * fVar89;
    auVar31._16_4_ = fStack_148 * fVar90;
    auVar31._20_4_ = fStack_144 * fVar91;
    auVar31._24_4_ = fStack_140 * fVar92;
    auVar31._28_4_ = fStack_13c;
    auVar19 = vsubps_avx(auVar19,auVar31);
    auVar32._4_4_ = fVar224 * local_b8._4_4_;
    auVar32._0_4_ = fVar153 * local_b8._0_4_;
    auVar32._8_4_ = fVar198 * local_b8._8_4_;
    auVar32._12_4_ = fVar163 * local_b8._12_4_;
    auVar32._16_4_ = fVar225 * local_b8._16_4_;
    auVar32._20_4_ = fVar199 * local_b8._20_4_;
    auVar32._24_4_ = fVar164 * local_b8._24_4_;
    auVar32._28_4_ = fStack_13c;
    auVar33._4_4_ = fVar200 * fStack_4e4;
    auVar33._0_4_ = fVar226 * local_4e8;
    auVar33._8_4_ = fVar165 * fStack_4e0;
    auVar33._12_4_ = fVar89 * fStack_4dc;
    auVar33._16_4_ = fVar90 * fStack_4d8;
    auVar33._20_4_ = fVar91 * fStack_4d4;
    auVar33._24_4_ = fVar92 * fStack_4d0;
    auVar33._28_4_ = local_b8._28_4_;
    auVar26 = vsubps_avx(auVar32,auVar33);
    auVar34._4_4_ = fVar224 * auVar20._4_4_;
    auVar34._0_4_ = fVar153 * auVar20._0_4_;
    auVar34._8_4_ = fVar198 * auVar20._8_4_;
    auVar34._12_4_ = fVar163 * auVar20._12_4_;
    auVar34._16_4_ = fVar225 * auVar20._16_4_;
    auVar34._20_4_ = fVar199 * auVar20._20_4_;
    auVar34._24_4_ = fVar164 * auVar20._24_4_;
    auVar34._28_4_ = auVar85._28_4_ + auVar21._28_4_;
    auVar21._4_4_ = auVar84._4_4_ * fVar200;
    auVar21._0_4_ = auVar84._0_4_ * fVar226;
    auVar21._8_4_ = auVar84._8_4_ * fVar165;
    auVar21._12_4_ = auVar84._12_4_ * fVar89;
    auVar21._16_4_ = auVar84._16_4_ * fVar90;
    auVar21._20_4_ = auVar84._20_4_ * fVar91;
    auVar21._24_4_ = auVar84._24_4_ * fVar92;
    auVar21._28_4_ = auVar86._28_4_ + auVar15._28_4_;
    auVar21 = vsubps_avx(auVar34,auVar21);
    auVar17 = vminps_avx(auVar22,auVar16);
    auVar83 = vmaxps_avx(auVar22,auVar16);
    auVar18 = vminps_avx(auVar23,auVar24);
    auVar18 = vminps_avx(auVar17,auVar18);
    auVar17 = vmaxps_avx(auVar23,auVar24);
    auVar83 = vmaxps_avx(auVar83,auVar17);
    auVar15 = vminps_avx(auVar25,auVar19);
    auVar17 = vmaxps_avx(auVar25,auVar19);
    auVar16 = vminps_avx(auVar26,auVar21);
    auVar16 = vminps_avx(auVar15,auVar16);
    auVar16 = vminps_avx(auVar18,auVar16);
    auVar18 = vmaxps_avx(auVar26,auVar21);
    auVar17 = vmaxps_avx(auVar17,auVar18);
    auVar17 = vmaxps_avx(auVar83,auVar17);
    auVar83 = vcmpps_avx(auVar16,local_78,2);
    auVar17 = vcmpps_avx(auVar17,local_98,5);
    auVar83 = vandps_avx(auVar17,auVar83);
    auVar17 = local_198 & auVar83;
    if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar17 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar17 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar17 >> 0x7f,0) != '\0') ||
          (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar17 >> 0xbf,0) != '\0') ||
        (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar17[0x1f] < '\0')
    {
      auVar17 = vsubps_avx(_local_408,local_d8);
      auVar18 = vsubps_avx(auVar84,auVar223);
      fVar224 = auVar17._0_4_ + auVar18._0_4_;
      fVar198 = auVar17._4_4_ + auVar18._4_4_;
      fVar163 = auVar17._8_4_ + auVar18._8_4_;
      fVar225 = auVar17._12_4_ + auVar18._12_4_;
      fVar199 = auVar17._16_4_ + auVar18._16_4_;
      fVar164 = auVar17._20_4_ + auVar18._20_4_;
      fVar226 = auVar17._24_4_ + auVar18._24_4_;
      auVar16 = vsubps_avx(local_f8,auVar162);
      auVar19 = vsubps_avx(auVar20,auVar252);
      fVar200 = auVar16._0_4_ + auVar19._0_4_;
      fVar165 = auVar16._4_4_ + auVar19._4_4_;
      fVar89 = auVar16._8_4_ + auVar19._8_4_;
      fVar90 = auVar16._12_4_ + auVar19._12_4_;
      fVar91 = auVar16._16_4_ + auVar19._16_4_;
      fVar92 = auVar16._20_4_ + auVar19._20_4_;
      fVar93 = auVar16._24_4_ + auVar19._24_4_;
      fVar153 = auVar19._28_4_;
      auVar35._4_4_ = auVar162._4_4_ * fVar198;
      auVar35._0_4_ = auVar162._0_4_ * fVar224;
      auVar35._8_4_ = auVar162._8_4_ * fVar163;
      auVar35._12_4_ = auVar162._12_4_ * fVar225;
      auVar35._16_4_ = auVar162._16_4_ * fVar199;
      auVar35._20_4_ = auVar162._20_4_ * fVar164;
      auVar35._24_4_ = auVar162._24_4_ * fVar226;
      auVar35._28_4_ = auVar162._28_4_;
      auVar36._4_4_ = local_d8._4_4_ * fVar165;
      auVar36._0_4_ = local_d8._0_4_ * fVar200;
      auVar36._8_4_ = local_d8._8_4_ * fVar89;
      auVar36._12_4_ = local_d8._12_4_ * fVar90;
      auVar36._16_4_ = local_d8._16_4_ * fVar91;
      auVar36._20_4_ = local_d8._20_4_ * fVar92;
      auVar36._24_4_ = local_d8._24_4_ * fVar93;
      auVar36._28_4_ = local_d8._28_4_;
      auVar19 = vsubps_avx(auVar35,auVar36);
      auVar37._4_4_ = fVar198 * fStack_134;
      auVar37._0_4_ = fVar224 * local_138;
      auVar37._8_4_ = fVar163 * fStack_130;
      auVar37._12_4_ = fVar225 * fStack_12c;
      auVar37._16_4_ = fVar199 * fStack_128;
      auVar37._20_4_ = fVar164 * fStack_124;
      auVar37._24_4_ = fVar226 * fStack_120;
      auVar37._28_4_ = auVar162._28_4_;
      auVar38._4_4_ = fVar165 * fStack_114;
      auVar38._0_4_ = fVar200 * local_118;
      auVar38._8_4_ = fVar89 * fStack_110;
      auVar38._12_4_ = fVar90 * fStack_10c;
      auVar38._16_4_ = fVar91 * fStack_108;
      auVar38._20_4_ = fVar92 * fStack_104;
      auVar38._24_4_ = fVar93 * fStack_100;
      auVar38._28_4_ = fVar153;
      auVar21 = vsubps_avx(auVar37,auVar38);
      auVar39._4_4_ = fVar198 * (float)local_5a8._4_4_;
      auVar39._0_4_ = fVar224 * (float)local_5a8._0_4_;
      auVar39._8_4_ = fVar163 * fStack_5a0;
      auVar39._12_4_ = fVar225 * fStack_59c;
      auVar39._16_4_ = fVar199 * fStack_598;
      auVar39._20_4_ = fVar164 * fStack_594;
      auVar39._24_4_ = fVar226 * fStack_590;
      auVar39._28_4_ = fVar153;
      auVar40._4_4_ = fVar165 * (float)local_5c8._4_4_;
      auVar40._0_4_ = fVar200 * (float)local_5c8._0_4_;
      auVar40._8_4_ = fVar89 * fStack_5c0;
      auVar40._12_4_ = fVar90 * fStack_5bc;
      auVar40._16_4_ = fVar91 * fStack_5b8;
      auVar40._20_4_ = fVar92 * fStack_5b4;
      auVar40._24_4_ = fVar93 * fStack_5b0;
      auVar40._28_4_ = auVar15._28_4_;
      auVar85 = vsubps_avx(auVar39,auVar40);
      auVar41._4_4_ = local_f8._4_4_ * fVar198;
      auVar41._0_4_ = local_f8._0_4_ * fVar224;
      auVar41._8_4_ = local_f8._8_4_ * fVar163;
      auVar41._12_4_ = local_f8._12_4_ * fVar225;
      auVar41._16_4_ = local_f8._16_4_ * fVar199;
      auVar41._20_4_ = local_f8._20_4_ * fVar164;
      auVar41._24_4_ = local_f8._24_4_ * fVar226;
      auVar41._28_4_ = auVar15._28_4_;
      auVar42._4_4_ = local_408._4_4_ * fVar165;
      auVar42._0_4_ = local_408._0_4_ * fVar200;
      auVar42._8_4_ = local_408._8_4_ * fVar89;
      auVar42._12_4_ = local_408._12_4_ * fVar90;
      auVar42._16_4_ = local_408._16_4_ * fVar91;
      auVar42._20_4_ = local_408._20_4_ * fVar92;
      uVar58 = local_408._28_4_;
      auVar42._24_4_ = local_408._24_4_ * fVar93;
      auVar42._28_4_ = uVar58;
      auVar86 = vsubps_avx(auVar41,auVar42);
      auVar43._4_4_ = auVar252._4_4_ * fVar198;
      auVar43._0_4_ = auVar252._0_4_ * fVar224;
      auVar43._8_4_ = auVar252._8_4_ * fVar163;
      auVar43._12_4_ = auVar252._12_4_ * fVar225;
      auVar43._16_4_ = auVar252._16_4_ * fVar199;
      auVar43._20_4_ = auVar252._20_4_ * fVar164;
      auVar43._24_4_ = auVar252._24_4_ * fVar226;
      auVar43._28_4_ = uVar58;
      auVar44._4_4_ = auVar223._4_4_ * fVar165;
      auVar44._0_4_ = auVar223._0_4_ * fVar200;
      auVar44._8_4_ = auVar223._8_4_ * fVar89;
      auVar44._12_4_ = auVar223._12_4_ * fVar90;
      auVar44._16_4_ = auVar223._16_4_ * fVar91;
      auVar44._20_4_ = auVar223._20_4_ * fVar92;
      auVar44._24_4_ = auVar223._24_4_ * fVar93;
      auVar44._28_4_ = auVar223._28_4_;
      auVar22 = vsubps_avx(auVar43,auVar44);
      auVar45._4_4_ = fVar198 * fStack_174;
      auVar45._0_4_ = fVar224 * local_178;
      auVar45._8_4_ = fVar163 * fStack_170;
      auVar45._12_4_ = fVar225 * fStack_16c;
      auVar45._16_4_ = fVar199 * fStack_168;
      auVar45._20_4_ = fVar164 * fStack_164;
      auVar45._24_4_ = fVar226 * fStack_160;
      auVar45._28_4_ = uVar58;
      auVar46._4_4_ = fVar165 * fStack_154;
      auVar46._0_4_ = fVar200 * local_158;
      auVar46._8_4_ = fVar89 * fStack_150;
      auVar46._12_4_ = fVar90 * fStack_14c;
      auVar46._16_4_ = fVar91 * fStack_148;
      auVar46._20_4_ = fVar92 * fStack_144;
      auVar46._24_4_ = fVar93 * fStack_140;
      auVar46._28_4_ = auVar252._28_4_;
      auVar23 = vsubps_avx(auVar45,auVar46);
      auVar47._4_4_ = fVar198 * local_b8._4_4_;
      auVar47._0_4_ = fVar224 * local_b8._0_4_;
      auVar47._8_4_ = fVar163 * local_b8._8_4_;
      auVar47._12_4_ = fVar225 * local_b8._12_4_;
      auVar47._16_4_ = fVar199 * local_b8._16_4_;
      auVar47._20_4_ = fVar164 * local_b8._20_4_;
      auVar47._24_4_ = fVar226 * local_b8._24_4_;
      auVar47._28_4_ = auVar252._28_4_;
      auVar48._4_4_ = fStack_4e4 * fVar165;
      auVar48._0_4_ = local_4e8 * fVar200;
      auVar48._8_4_ = fStack_4e0 * fVar89;
      auVar48._12_4_ = fStack_4dc * fVar90;
      auVar48._16_4_ = fStack_4d8 * fVar91;
      auVar48._20_4_ = fStack_4d4 * fVar92;
      auVar48._24_4_ = fStack_4d0 * fVar93;
      auVar48._28_4_ = local_f8._28_4_;
      auVar24 = vsubps_avx(auVar47,auVar48);
      auVar49._4_4_ = fVar198 * auVar20._4_4_;
      auVar49._0_4_ = fVar224 * auVar20._0_4_;
      auVar49._8_4_ = fVar163 * auVar20._8_4_;
      auVar49._12_4_ = fVar225 * auVar20._12_4_;
      auVar49._16_4_ = fVar199 * auVar20._16_4_;
      auVar49._20_4_ = fVar164 * auVar20._20_4_;
      auVar49._24_4_ = fVar226 * auVar20._24_4_;
      auVar49._28_4_ = auVar17._28_4_ + auVar18._28_4_;
      auVar50._4_4_ = auVar84._4_4_ * fVar165;
      auVar50._0_4_ = auVar84._0_4_ * fVar200;
      auVar50._8_4_ = auVar84._8_4_ * fVar89;
      auVar50._12_4_ = auVar84._12_4_ * fVar90;
      auVar50._16_4_ = auVar84._16_4_ * fVar91;
      auVar50._20_4_ = auVar84._20_4_ * fVar92;
      auVar50._24_4_ = auVar84._24_4_ * fVar93;
      auVar50._28_4_ = auVar16._28_4_ + fVar153;
      auVar20 = vsubps_avx(auVar49,auVar50);
      auVar18 = vminps_avx(auVar19,auVar21);
      auVar17 = vmaxps_avx(auVar19,auVar21);
      auVar15 = vminps_avx(auVar85,auVar86);
      auVar15 = vminps_avx(auVar18,auVar15);
      auVar18 = vmaxps_avx(auVar85,auVar86);
      auVar17 = vmaxps_avx(auVar17,auVar18);
      auVar16 = vminps_avx(auVar22,auVar23);
      auVar18 = vmaxps_avx(auVar22,auVar23);
      auVar84 = vminps_avx(auVar24,auVar20);
      auVar16 = vminps_avx(auVar16,auVar84);
      auVar16 = vminps_avx(auVar15,auVar16);
      auVar15 = vmaxps_avx(auVar24,auVar20);
      auVar18 = vmaxps_avx(auVar18,auVar15);
      auVar18 = vmaxps_avx(auVar17,auVar18);
      auVar17 = vcmpps_avx(auVar16,local_78,2);
      auVar18 = vcmpps_avx(auVar18,local_98,5);
      auVar17 = vandps_avx(auVar18,auVar17);
      auVar83 = vandps_avx(local_198,auVar83);
      auVar18 = auVar83 & auVar17;
      if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar18 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar18 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar18 >> 0x7f,0) != '\0') ||
            (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar18 >> 0xbf,0) != '\0') ||
          (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar18[0x1f] < '\0') {
        auVar83 = vandps_avx(auVar17,auVar83);
        uVar54 = vmovmskps_avx(auVar83);
        if (uVar54 != 0) {
          mask_stack[uVar59] = uVar54 & 0xff;
          BVar2 = (BBox1f)vmovlps_avx(auVar169);
          cu_stack[uVar59] = BVar2;
          BVar2 = (BBox1f)vmovlps_avx(auVar130);
          cv_stack[uVar59] = BVar2;
          uVar59 = (ulong)((int)uVar59 + 1);
        }
      }
    }
LAB_007cfbda:
    do {
      do {
        do {
          do {
            if ((int)uVar59 == 0) {
              if (bVar60) goto LAB_007d0bcd;
              uVar58 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar82._4_4_ = uVar58;
              auVar82._0_4_ = uVar58;
              auVar82._8_4_ = uVar58;
              auVar82._12_4_ = uVar58;
              auVar219 = vcmpps_avx(auVar157,auVar82,2);
              uVar55 = vmovmskps_avx(auVar219);
              local_480 = (ulong)((uint)uVar61 & uVar55);
              goto LAB_007cecdc;
            }
            uVar57 = (int)uVar59 - 1;
            uVar54 = mask_stack[uVar57];
            fVar153 = cu_stack[uVar57].lower;
            fVar224 = cu_stack[uVar57].upper;
            auVar291._8_8_ = 0;
            auVar291._0_4_ = cv_stack[uVar57].lower;
            auVar291._4_4_ = cv_stack[uVar57].upper;
            auVar295 = ZEXT1664(auVar291);
            uVar10 = 0;
            if (uVar54 != 0) {
              for (; (uVar54 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
              }
            }
            uVar54 = uVar54 - 1 & uVar54;
            mask_stack[uVar57] = uVar54;
            if (uVar54 == 0) {
              uVar59 = (ulong)uVar57;
            }
            fVar163 = (float)(uVar10 + 1) * 0.14285715;
            fVar198 = (1.0 - (float)uVar10 * 0.14285715) * fVar153 +
                      fVar224 * (float)uVar10 * 0.14285715;
            fVar153 = (1.0 - fVar163) * fVar153 + fVar224 * fVar163;
            fVar224 = fVar153 - fVar198;
            if (0.16666667 <= fVar224) {
              auVar71 = vinsertps_avx(ZEXT416((uint)fVar198),ZEXT416((uint)fVar153),0x10);
              auVar297 = ZEXT1664(auVar71);
              goto LAB_007cf576;
            }
            auVar71 = vshufps_avx(auVar291,auVar291,0x50);
            auVar101._8_4_ = 0x3f800000;
            auVar101._0_8_ = 0x3f8000003f800000;
            auVar101._12_4_ = 0x3f800000;
            auVar214 = vsubps_avx(auVar101,auVar71);
            fVar163 = auVar71._0_4_;
            fVar225 = auVar71._4_4_;
            fVar199 = auVar71._8_4_;
            fVar164 = auVar71._12_4_;
            fVar226 = auVar214._0_4_;
            fVar200 = auVar214._4_4_;
            fVar165 = auVar214._8_4_;
            fVar89 = auVar214._12_4_;
            auVar132._0_4_ = auVar274._0_4_ * fVar163 + fVar226 * fVar94;
            auVar132._4_4_ = auVar274._4_4_ * fVar225 + fVar200 * fVar125;
            auVar132._8_4_ = auVar274._0_4_ * fVar199 + fVar165 * fVar94;
            auVar132._12_4_ = auVar274._4_4_ * fVar164 + fVar89 * fVar125;
            auVar171._0_4_ = auVar230._0_4_ * fVar163 + fVar226 * fVar95;
            auVar171._4_4_ = auVar230._4_4_ * fVar225 + fVar200 * fVar126;
            auVar171._8_4_ = auVar230._0_4_ * fVar199 + fVar165 * fVar95;
            auVar171._12_4_ = auVar230._4_4_ * fVar164 + fVar89 * fVar126;
            auVar190._0_4_ = auVar100._0_4_ * fVar163 + auVar289._0_4_ * fVar226;
            auVar190._4_4_ = auVar100._4_4_ * fVar225 + auVar289._4_4_ * fVar200;
            auVar190._8_4_ = auVar100._0_4_ * fVar199 + auVar289._0_4_ * fVar165;
            auVar190._12_4_ = auVar100._4_4_ * fVar164 + auVar289._4_4_ * fVar89;
            auVar68._0_4_ = auVar66._0_4_ * fVar163 + auVar285._0_4_ * fVar226;
            auVar68._4_4_ = auVar66._4_4_ * fVar225 + auVar285._4_4_ * fVar200;
            auVar68._8_4_ = auVar66._0_4_ * fVar199 + auVar285._0_4_ * fVar165;
            auVar68._12_4_ = auVar66._4_4_ * fVar164 + auVar285._4_4_ * fVar89;
            auVar122._16_16_ = auVar132;
            auVar122._0_16_ = auVar132;
            auVar151._16_16_ = auVar171;
            auVar151._0_16_ = auVar171;
            auVar181._16_16_ = auVar190;
            auVar181._0_16_ = auVar190;
            auVar83 = ZEXT2032(CONCAT416(fVar153,ZEXT416((uint)fVar198)));
            auVar83 = vshufps_avx(auVar83,auVar83,0);
            auVar17 = vsubps_avx(auVar151,auVar122);
            fVar163 = auVar83._0_4_;
            fVar225 = auVar83._4_4_;
            fVar199 = auVar83._8_4_;
            fVar164 = auVar83._12_4_;
            fVar226 = auVar83._16_4_;
            fVar200 = auVar83._20_4_;
            fVar165 = auVar83._24_4_;
            auVar123._0_4_ = auVar132._0_4_ + auVar17._0_4_ * fVar163;
            auVar123._4_4_ = auVar132._4_4_ + auVar17._4_4_ * fVar225;
            auVar123._8_4_ = auVar132._8_4_ + auVar17._8_4_ * fVar199;
            auVar123._12_4_ = auVar132._12_4_ + auVar17._12_4_ * fVar164;
            auVar123._16_4_ = auVar132._0_4_ + auVar17._16_4_ * fVar226;
            auVar123._20_4_ = auVar132._4_4_ + auVar17._20_4_ * fVar200;
            auVar123._24_4_ = auVar132._8_4_ + auVar17._24_4_ * fVar165;
            auVar123._28_4_ = auVar132._12_4_ + auVar17._28_4_;
            auVar83 = vsubps_avx(auVar181,auVar151);
            auVar152._0_4_ = auVar171._0_4_ + auVar83._0_4_ * fVar163;
            auVar152._4_4_ = auVar171._4_4_ + auVar83._4_4_ * fVar225;
            auVar152._8_4_ = auVar171._8_4_ + auVar83._8_4_ * fVar199;
            auVar152._12_4_ = auVar171._12_4_ + auVar83._12_4_ * fVar164;
            auVar152._16_4_ = auVar171._0_4_ + auVar83._16_4_ * fVar226;
            auVar152._20_4_ = auVar171._4_4_ + auVar83._20_4_ * fVar200;
            auVar152._24_4_ = auVar171._8_4_ + auVar83._24_4_ * fVar165;
            auVar152._28_4_ = auVar171._12_4_ + auVar83._28_4_;
            auVar71 = vsubps_avx(auVar68,auVar190);
            auVar87._0_4_ = auVar190._0_4_ + auVar71._0_4_ * fVar163;
            auVar87._4_4_ = auVar190._4_4_ + auVar71._4_4_ * fVar225;
            auVar87._8_4_ = auVar190._8_4_ + auVar71._8_4_ * fVar199;
            auVar87._12_4_ = auVar190._12_4_ + auVar71._12_4_ * fVar164;
            auVar87._16_4_ = auVar190._0_4_ + auVar71._0_4_ * fVar226;
            auVar87._20_4_ = auVar190._4_4_ + auVar71._4_4_ * fVar200;
            auVar87._24_4_ = auVar190._8_4_ + auVar71._8_4_ * fVar165;
            auVar87._28_4_ = auVar190._12_4_ + auVar71._12_4_;
            auVar83 = vsubps_avx(auVar152,auVar123);
            auVar124._0_4_ = auVar123._0_4_ + fVar163 * auVar83._0_4_;
            auVar124._4_4_ = auVar123._4_4_ + fVar225 * auVar83._4_4_;
            auVar124._8_4_ = auVar123._8_4_ + fVar199 * auVar83._8_4_;
            auVar124._12_4_ = auVar123._12_4_ + fVar164 * auVar83._12_4_;
            auVar124._16_4_ = auVar123._16_4_ + fVar226 * auVar83._16_4_;
            auVar124._20_4_ = auVar123._20_4_ + fVar200 * auVar83._20_4_;
            auVar124._24_4_ = auVar123._24_4_ + fVar165 * auVar83._24_4_;
            auVar124._28_4_ = auVar123._28_4_ + auVar83._28_4_;
            auVar83 = vsubps_avx(auVar87,auVar152);
            auVar88._0_4_ = auVar152._0_4_ + fVar163 * auVar83._0_4_;
            auVar88._4_4_ = auVar152._4_4_ + fVar225 * auVar83._4_4_;
            auVar88._8_4_ = auVar152._8_4_ + fVar199 * auVar83._8_4_;
            auVar88._12_4_ = auVar152._12_4_ + fVar164 * auVar83._12_4_;
            auVar88._16_4_ = auVar152._16_4_ + fVar226 * auVar83._16_4_;
            auVar88._20_4_ = auVar152._20_4_ + fVar200 * auVar83._20_4_;
            auVar88._24_4_ = auVar152._24_4_ + fVar165 * auVar83._24_4_;
            auVar88._28_4_ = auVar152._28_4_ + auVar83._28_4_;
            auVar83 = vsubps_avx(auVar88,auVar124);
            auVar208._0_4_ = auVar124._0_4_ + fVar163 * auVar83._0_4_;
            auVar208._4_4_ = auVar124._4_4_ + fVar225 * auVar83._4_4_;
            auVar208._8_4_ = auVar124._8_4_ + fVar199 * auVar83._8_4_;
            auVar208._12_4_ = auVar124._12_4_ + fVar164 * auVar83._12_4_;
            auVar212._16_4_ = auVar124._16_4_ + fVar226 * auVar83._16_4_;
            auVar212._0_16_ = auVar208;
            auVar212._20_4_ = auVar124._20_4_ + fVar200 * auVar83._20_4_;
            auVar212._24_4_ = auVar124._24_4_ + fVar165 * auVar83._24_4_;
            auVar212._28_4_ = auVar124._28_4_ + auVar152._28_4_;
            auVar67 = auVar212._16_16_;
            auVar103 = vshufps_avx(ZEXT416((uint)(fVar224 * 0.33333334)),
                                   ZEXT416((uint)(fVar224 * 0.33333334)),0);
            auVar172._0_4_ = auVar208._0_4_ + auVar103._0_4_ * auVar83._0_4_ * 3.0;
            auVar172._4_4_ = auVar208._4_4_ + auVar103._4_4_ * auVar83._4_4_ * 3.0;
            auVar172._8_4_ = auVar208._8_4_ + auVar103._8_4_ * auVar83._8_4_ * 3.0;
            auVar172._12_4_ = auVar208._12_4_ + auVar103._12_4_ * auVar83._12_4_ * 3.0;
            auVar148 = vshufpd_avx(auVar208,auVar208,3);
            auVar115 = vshufpd_avx(auVar67,auVar67,3);
            _local_408 = auVar148;
            auVar71 = vsubps_avx(auVar148,auVar208);
            auVar214 = vsubps_avx(auVar115,auVar67);
            auVar69._0_4_ = auVar71._0_4_ + auVar214._0_4_;
            auVar69._4_4_ = auVar71._4_4_ + auVar214._4_4_;
            auVar69._8_4_ = auVar71._8_4_ + auVar214._8_4_;
            auVar69._12_4_ = auVar71._12_4_ + auVar214._12_4_;
            auVar71 = vmovshdup_avx(auVar208);
            auVar214 = vmovshdup_avx(auVar172);
            auVar134 = vshufps_avx(auVar69,auVar69,0);
            auVar104 = vshufps_avx(auVar69,auVar69,0x55);
            fVar163 = auVar104._0_4_;
            fVar225 = auVar104._4_4_;
            fVar199 = auVar104._8_4_;
            fVar164 = auVar104._12_4_;
            fVar226 = auVar134._0_4_;
            fVar200 = auVar134._4_4_;
            fVar165 = auVar134._8_4_;
            fVar89 = auVar134._12_4_;
            auVar70._0_4_ = fVar226 * auVar208._0_4_ + auVar71._0_4_ * fVar163;
            auVar70._4_4_ = fVar200 * auVar208._4_4_ + auVar71._4_4_ * fVar225;
            auVar70._8_4_ = fVar165 * auVar208._8_4_ + auVar71._8_4_ * fVar199;
            auVar70._12_4_ = fVar89 * auVar208._12_4_ + auVar71._12_4_ * fVar164;
            auVar268._0_4_ = fVar226 * auVar172._0_4_ + auVar214._0_4_ * fVar163;
            auVar268._4_4_ = fVar200 * auVar172._4_4_ + auVar214._4_4_ * fVar225;
            auVar268._8_4_ = fVar165 * auVar172._8_4_ + auVar214._8_4_ * fVar199;
            auVar268._12_4_ = fVar89 * auVar172._12_4_ + auVar214._12_4_ * fVar164;
            auVar214 = vshufps_avx(auVar70,auVar70,0xe8);
            auVar134 = vshufps_avx(auVar268,auVar268,0xe8);
            auVar71 = vcmpps_avx(auVar214,auVar134,1);
            uVar54 = vextractps_avx(auVar71,0);
            auVar104 = auVar268;
            if ((uVar54 & 1) == 0) {
              auVar104 = auVar70;
            }
            auVar102._0_4_ = auVar103._0_4_ * auVar83._16_4_ * 3.0;
            auVar102._4_4_ = auVar103._4_4_ * auVar83._20_4_ * 3.0;
            auVar102._8_4_ = auVar103._8_4_ * auVar83._24_4_ * 3.0;
            auVar102._12_4_ = auVar103._12_4_ * 0.0;
            auVar129 = vsubps_avx(auVar67,auVar102);
            auVar103 = vmovshdup_avx(auVar129);
            auVar67 = vmovshdup_avx(auVar67);
            fVar90 = auVar129._0_4_;
            fVar91 = auVar129._4_4_;
            auVar191._0_4_ = fVar90 * fVar226 + auVar103._0_4_ * fVar163;
            auVar191._4_4_ = fVar91 * fVar200 + auVar103._4_4_ * fVar225;
            auVar191._8_4_ = auVar129._8_4_ * fVar165 + auVar103._8_4_ * fVar199;
            auVar191._12_4_ = auVar129._12_4_ * fVar89 + auVar103._12_4_ * fVar164;
            auVar296._0_4_ = fVar226 * auVar212._16_4_ + auVar67._0_4_ * fVar163;
            auVar296._4_4_ = fVar200 * auVar212._20_4_ + auVar67._4_4_ * fVar225;
            auVar296._8_4_ = fVar165 * auVar212._24_4_ + auVar67._8_4_ * fVar199;
            auVar296._12_4_ = fVar89 * auVar212._28_4_ + auVar67._12_4_ * fVar164;
            auVar67 = vshufps_avx(auVar191,auVar191,0xe8);
            auVar99 = vshufps_avx(auVar296,auVar296,0xe8);
            auVar103 = vcmpps_avx(auVar67,auVar99,1);
            uVar54 = vextractps_avx(auVar103,0);
            auVar130 = auVar296;
            if ((uVar54 & 1) == 0) {
              auVar130 = auVar191;
            }
            auVar104 = vmaxss_avx(auVar130,auVar104);
            auVar214 = vminps_avx(auVar214,auVar134);
            auVar134 = vminps_avx(auVar67,auVar99);
            auVar134 = vminps_avx(auVar214,auVar134);
            auVar71 = vshufps_avx(auVar71,auVar71,0x55);
            auVar71 = vblendps_avx(auVar71,auVar103,2);
            auVar103 = vpslld_avx(auVar71,0x1f);
            auVar71 = vshufpd_avx(auVar268,auVar268,1);
            auVar71 = vinsertps_avx(auVar71,auVar296,0x9c);
            auVar214 = vshufpd_avx(auVar70,auVar70,1);
            auVar214 = vinsertps_avx(auVar214,auVar191,0x9c);
            auVar71 = vblendvps_avx(auVar214,auVar71,auVar103);
            auVar214 = vmovshdup_avx(auVar71);
            auVar71 = vmaxss_avx(auVar214,auVar71);
            fVar199 = auVar134._0_4_;
            auVar214 = vmovshdup_avx(auVar134);
            fVar225 = auVar71._0_4_;
            fVar164 = auVar214._0_4_;
            fVar163 = auVar104._0_4_;
            if ((fVar199 < 0.0001) && (-0.0001 < fVar225)) break;
            if ((fVar164 < 0.0001 && -0.0001 < fVar163) || (fVar199 < 0.0001 && -0.0001 < fVar163))
            break;
            auVar103 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar71,1);
            auVar214 = vcmpps_avx(auVar214,SUB6416(ZEXT464(0x38d1b717),0),1);
            auVar214 = vandps_avx(auVar214,auVar103);
          } while ((auVar214 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
          auVar103 = vcmpps_avx(auVar134,_DAT_01f45a50,1);
          auVar214 = vcmpss_avx(auVar104,ZEXT416(0) << 0x20,1);
          auVar133._8_4_ = 0x3f800000;
          auVar133._0_8_ = 0x3f8000003f800000;
          auVar133._12_4_ = 0x3f800000;
          auVar173._8_4_ = 0xbf800000;
          auVar173._0_8_ = 0xbf800000bf800000;
          auVar173._12_4_ = 0xbf800000;
          auVar214 = vblendvps_avx(auVar133,auVar173,auVar214);
          auVar103 = vblendvps_avx(auVar133,auVar173,auVar103);
          auVar134 = vcmpss_avx(auVar103,auVar214,4);
          auVar134 = vpshufd_avx(ZEXT416(auVar134._0_4_ & 1),0x50);
          auVar134 = vpslld_avx(auVar134,0x1f);
          auVar134 = vpsrad_avx(auVar134,0x1f);
          auVar134 = vpandn_avx(auVar134,_DAT_01f7afb0);
          auVar104 = vmovshdup_avx(auVar103);
          fVar226 = auVar104._0_4_;
          if ((auVar103._0_4_ != fVar226) || (NAN(auVar103._0_4_) || NAN(fVar226))) {
            if ((fVar164 != fVar199) || (NAN(fVar164) || NAN(fVar199))) {
              fVar199 = -fVar199 / (fVar164 - fVar199);
              auVar103 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar199) * 0.0 + fVar199)));
            }
            else {
              auVar103 = ZEXT816(0x3f80000000000000);
              if ((fVar199 != 0.0) || (NAN(fVar199))) {
                auVar103 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar67 = vcmpps_avx(auVar134,auVar103,1);
            auVar104 = vblendps_avx(auVar134,auVar103,2);
            auVar103 = vblendps_avx(auVar103,auVar134,2);
            auVar134 = vblendvps_avx(auVar103,auVar104,auVar67);
          }
          auVar71 = vcmpss_avx(auVar71,ZEXT416(0) << 0x20,1);
          auVar135._8_4_ = 0x3f800000;
          auVar135._0_8_ = 0x3f8000003f800000;
          auVar135._12_4_ = 0x3f800000;
          auVar174._8_4_ = 0xbf800000;
          auVar174._0_8_ = 0xbf800000bf800000;
          auVar174._12_4_ = 0xbf800000;
          auVar71 = vblendvps_avx(auVar135,auVar174,auVar71);
          fVar199 = auVar71._0_4_;
          if ((auVar214._0_4_ != fVar199) || (NAN(auVar214._0_4_) || NAN(fVar199))) {
            if ((fVar225 != fVar163) || (NAN(fVar225) || NAN(fVar163))) {
              fVar163 = -fVar163 / (fVar225 - fVar163);
              auVar71 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar163) * 0.0 + fVar163)));
            }
            else {
              auVar71 = ZEXT816(0x3f80000000000000);
              if ((fVar163 != 0.0) || (NAN(fVar163))) {
                auVar71 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar103 = vcmpps_avx(auVar134,auVar71,1);
            auVar214 = vblendps_avx(auVar134,auVar71,2);
            auVar71 = vblendps_avx(auVar71,auVar134,2);
            auVar134 = vblendvps_avx(auVar71,auVar214,auVar103);
          }
          if ((fVar226 != fVar199) || (NAN(fVar226) || NAN(fVar199))) {
            auVar72._8_4_ = 0x3f800000;
            auVar72._0_8_ = 0x3f8000003f800000;
            auVar72._12_4_ = 0x3f800000;
            auVar71 = vcmpps_avx(auVar134,auVar72,1);
            auVar214 = vinsertps_avx(auVar134,SUB6416(ZEXT464(0x3f800000),0),0x10);
            auVar136._4_12_ = auVar134._4_12_;
            auVar136._0_4_ = 0x3f800000;
            auVar134 = vblendvps_avx(auVar136,auVar214,auVar71);
          }
          auVar71 = vcmpps_avx(auVar134,_DAT_01f46740,1);
          auVar52._12_4_ = 0;
          auVar52._0_12_ = auVar134._4_12_;
          auVar214 = vinsertps_avx(auVar134,ZEXT416(0x3f800000),0x10);
          auVar71 = vblendvps_avx(auVar214,auVar52 << 0x20,auVar71);
          auVar214 = vmovshdup_avx(auVar71);
        } while (auVar214._0_4_ < auVar71._0_4_);
        auVar73._0_4_ = auVar71._0_4_ + -0.1;
        auVar73._4_4_ = auVar71._4_4_ + 0.1;
        auVar73._8_4_ = auVar71._8_4_ + 0.0;
        auVar73._12_4_ = auVar71._12_4_ + 0.0;
        auVar103 = vshufpd_avx(auVar172,auVar172,3);
        auVar209._8_8_ = 0x3f80000000000000;
        auVar209._0_8_ = 0x3f80000000000000;
        auVar71 = vcmpps_avx(auVar73,auVar209,1);
        auVar51._12_4_ = 0;
        auVar51._0_12_ = auVar73._4_12_;
        auVar214 = vinsertps_avx(auVar73,SUB6416(ZEXT464(0x3f800000),0),0x10);
        auVar71 = vblendvps_avx(auVar214,auVar51 << 0x20,auVar71);
        auVar214 = vshufpd_avx(auVar129,auVar129,3);
        auVar134 = vshufps_avx(auVar71,auVar71,0x50);
        auVar210._8_4_ = 0x3f800000;
        auVar210._0_8_ = 0x3f8000003f800000;
        auVar210._12_4_ = 0x3f800000;
        auVar104 = vsubps_avx(auVar210,auVar134);
        local_408._0_4_ = auVar148._0_4_;
        local_408._4_4_ = auVar148._4_4_;
        fStack_400 = auVar148._8_4_;
        fStack_3fc = auVar148._12_4_;
        fVar163 = auVar134._0_4_;
        fVar225 = auVar134._4_4_;
        fVar199 = auVar134._8_4_;
        fVar164 = auVar134._12_4_;
        local_588 = auVar115._0_4_;
        fStack_584 = auVar115._4_4_;
        fStack_580 = auVar115._8_4_;
        fStack_57c = auVar115._12_4_;
        fVar226 = auVar104._0_4_;
        fVar200 = auVar104._4_4_;
        fVar165 = auVar104._8_4_;
        fVar89 = auVar104._12_4_;
        auVar74._0_4_ = fVar163 * (float)local_408._0_4_ + fVar226 * auVar208._0_4_;
        auVar74._4_4_ = fVar225 * (float)local_408._4_4_ + fVar200 * auVar208._4_4_;
        auVar74._8_4_ = fVar199 * fStack_400 + fVar165 * auVar208._0_4_;
        auVar74._12_4_ = fVar164 * fStack_3fc + fVar89 * auVar208._4_4_;
        auVar192._0_4_ = auVar103._0_4_ * fVar163 + fVar226 * auVar172._0_4_;
        auVar192._4_4_ = auVar103._4_4_ * fVar225 + fVar200 * auVar172._4_4_;
        auVar192._8_4_ = auVar103._8_4_ * fVar199 + fVar165 * auVar172._0_4_;
        auVar192._12_4_ = auVar103._12_4_ * fVar164 + fVar89 * auVar172._4_4_;
        auVar222._0_4_ = auVar214._0_4_ * fVar163 + fVar226 * fVar90;
        auVar222._4_4_ = auVar214._4_4_ * fVar225 + fVar200 * fVar91;
        auVar222._8_4_ = auVar214._8_4_ * fVar199 + fVar165 * fVar90;
        auVar222._12_4_ = auVar214._12_4_ * fVar164 + fVar89 * fVar91;
        auVar260._0_4_ = fVar163 * local_588 + fVar226 * auVar212._16_4_;
        auVar260._4_4_ = fVar225 * fStack_584 + fVar200 * auVar212._20_4_;
        auVar260._8_4_ = fVar199 * fStack_580 + fVar165 * auVar212._16_4_;
        auVar260._12_4_ = fVar164 * fStack_57c + fVar89 * auVar212._20_4_;
        auVar115 = vsubps_avx(auVar210,auVar71);
        auVar214 = vmovshdup_avx(auVar291);
        auVar148 = vmovsldup_avx(auVar291);
        auVar211._0_4_ = auVar115._0_4_ * auVar148._0_4_ + auVar71._0_4_ * auVar214._0_4_;
        auVar211._4_4_ = auVar115._4_4_ * auVar148._4_4_ + auVar71._4_4_ * auVar214._4_4_;
        auVar211._8_4_ = auVar115._8_4_ * auVar148._8_4_ + auVar71._8_4_ * auVar214._8_4_;
        auVar211._12_4_ = auVar115._12_4_ * auVar148._12_4_ + auVar71._12_4_ * auVar214._12_4_;
        auVar129 = vmovshdup_avx(auVar211);
        auVar71 = vsubps_avx(auVar192,auVar74);
        auVar137._0_4_ = auVar71._0_4_ * 3.0;
        auVar137._4_4_ = auVar71._4_4_ * 3.0;
        auVar137._8_4_ = auVar71._8_4_ * 3.0;
        auVar137._12_4_ = auVar71._12_4_ * 3.0;
        auVar71 = vsubps_avx(auVar222,auVar192);
        auVar159._0_4_ = auVar71._0_4_ * 3.0;
        auVar159._4_4_ = auVar71._4_4_ * 3.0;
        auVar159._8_4_ = auVar71._8_4_ * 3.0;
        auVar159._12_4_ = auVar71._12_4_ * 3.0;
        auVar71 = vsubps_avx(auVar260,auVar222);
        auVar231._0_4_ = auVar71._0_4_ * 3.0;
        auVar231._4_4_ = auVar71._4_4_ * 3.0;
        auVar231._8_4_ = auVar71._8_4_ * 3.0;
        auVar231._12_4_ = auVar71._12_4_ * 3.0;
        auVar214 = vminps_avx(auVar159,auVar231);
        auVar71 = vmaxps_avx(auVar159,auVar231);
        auVar214 = vminps_avx(auVar137,auVar214);
        auVar71 = vmaxps_avx(auVar137,auVar71);
        auVar148 = vshufpd_avx(auVar214,auVar214,3);
        auVar115 = vshufpd_avx(auVar71,auVar71,3);
        auVar214 = vminps_avx(auVar214,auVar148);
        auVar71 = vmaxps_avx(auVar71,auVar115);
        auVar148 = vshufps_avx(ZEXT416((uint)(1.0 / fVar224)),ZEXT416((uint)(1.0 / fVar224)),0);
        auVar232._0_4_ = auVar148._0_4_ * auVar214._0_4_;
        auVar232._4_4_ = auVar148._4_4_ * auVar214._4_4_;
        auVar232._8_4_ = auVar148._8_4_ * auVar214._8_4_;
        auVar232._12_4_ = auVar148._12_4_ * auVar214._12_4_;
        auVar249._0_4_ = auVar148._0_4_ * auVar71._0_4_;
        auVar249._4_4_ = auVar148._4_4_ * auVar71._4_4_;
        auVar249._8_4_ = auVar148._8_4_ * auVar71._8_4_;
        auVar249._12_4_ = auVar148._12_4_ * auVar71._12_4_;
        auVar104 = ZEXT416((uint)(1.0 / (auVar129._0_4_ - auVar211._0_4_)));
        auVar71 = vshufpd_avx(auVar74,auVar74,3);
        auVar214 = vshufpd_avx(auVar192,auVar192,3);
        auVar148 = vshufpd_avx(auVar222,auVar222,3);
        auVar115 = vshufpd_avx(auVar260,auVar260,3);
        auVar71 = vsubps_avx(auVar71,auVar74);
        auVar103 = vsubps_avx(auVar214,auVar192);
        auVar134 = vsubps_avx(auVar148,auVar222);
        auVar115 = vsubps_avx(auVar115,auVar260);
        auVar214 = vminps_avx(auVar71,auVar103);
        auVar71 = vmaxps_avx(auVar71,auVar103);
        auVar148 = vminps_avx(auVar134,auVar115);
        auVar148 = vminps_avx(auVar214,auVar148);
        auVar214 = vmaxps_avx(auVar134,auVar115);
        auVar71 = vmaxps_avx(auVar71,auVar214);
        auVar214 = vshufps_avx(auVar104,auVar104,0);
        auVar286._0_4_ = auVar214._0_4_ * auVar148._0_4_;
        auVar286._4_4_ = auVar214._4_4_ * auVar148._4_4_;
        auVar286._8_4_ = auVar214._8_4_ * auVar148._8_4_;
        auVar286._12_4_ = auVar214._12_4_ * auVar148._12_4_;
        auVar292._0_4_ = auVar214._0_4_ * auVar71._0_4_;
        auVar292._4_4_ = auVar214._4_4_ * auVar71._4_4_;
        auVar292._8_4_ = auVar214._8_4_ * auVar71._8_4_;
        auVar292._12_4_ = auVar214._12_4_ * auVar71._12_4_;
        auVar71 = vmovsldup_avx(auVar211);
        auVar261._4_12_ = auVar71._4_12_;
        auVar261._0_4_ = fVar198;
        auVar269._4_12_ = auVar211._4_12_;
        auVar269._0_4_ = fVar153;
        auVar160._0_4_ = (fVar198 + fVar153) * 0.5;
        auVar160._4_4_ = (auVar71._4_4_ + auVar211._4_4_) * 0.5;
        auVar160._8_4_ = (auVar71._8_4_ + auVar211._8_4_) * 0.5;
        auVar160._12_4_ = (auVar71._12_4_ + auVar211._12_4_) * 0.5;
        auVar71 = vshufps_avx(auVar160,auVar160,0);
        local_258 = auVar11._0_4_;
        fStack_254 = auVar11._4_4_;
        fStack_250 = auVar11._8_4_;
        fStack_24c = auVar11._12_4_;
        fVar163 = auVar71._0_4_;
        fVar225 = auVar71._4_4_;
        fVar199 = auVar71._8_4_;
        fVar164 = auVar71._12_4_;
        p00.field_0.i[0] = auVar12._0_4_;
        p00.field_0.i[1] = auVar12._4_4_;
        p00.field_0.i[2] = auVar12._8_4_;
        p00.field_0.i[3] = auVar12._12_4_;
        auVar105._0_4_ = fVar163 * local_258 + p00.field_0.v[0];
        auVar105._4_4_ = fVar225 * fStack_254 + p00.field_0.v[1];
        auVar105._8_4_ = fVar199 * fStack_250 + p00.field_0.v[2];
        auVar105._12_4_ = fVar164 * fStack_24c + p00.field_0.v[3];
        local_268 = auVar156._0_4_;
        fStack_264 = auVar156._4_4_;
        fStack_260 = auVar156._8_4_;
        fStack_25c = auVar156._12_4_;
        p01.field_0.i[0] = auVar13._0_4_;
        p01.field_0.i[1] = auVar13._4_4_;
        p01.field_0.i[2] = auVar13._8_4_;
        p01.field_0.i[3] = auVar13._12_4_;
        auVar138._0_4_ = fVar163 * local_268 + p01.field_0.v[0];
        auVar138._4_4_ = fVar225 * fStack_264 + p01.field_0.v[1];
        auVar138._8_4_ = fVar199 * fStack_260 + p01.field_0.v[2];
        auVar138._12_4_ = fVar164 * fStack_25c + p01.field_0.v[3];
        local_278 = auVar167._0_4_;
        fStack_274 = auVar167._4_4_;
        fStack_270 = auVar167._8_4_;
        fStack_26c = auVar167._12_4_;
        p02.field_0.i[0] = auVar14._0_4_;
        p02.field_0.i[1] = auVar14._4_4_;
        p02.field_0.i[2] = auVar14._8_4_;
        p02.field_0.i[3] = auVar14._12_4_;
        auVar193._0_4_ = fVar163 * local_278 + p02.field_0.v[0];
        auVar193._4_4_ = fVar225 * fStack_274 + p02.field_0.v[1];
        auVar193._8_4_ = fVar199 * fStack_270 + p02.field_0.v[2];
        auVar193._12_4_ = fVar164 * fStack_26c + p02.field_0.v[3];
        auVar71 = vsubps_avx(auVar138,auVar105);
        auVar106._0_4_ = auVar105._0_4_ + fVar163 * auVar71._0_4_;
        auVar106._4_4_ = auVar105._4_4_ + fVar225 * auVar71._4_4_;
        auVar106._8_4_ = auVar105._8_4_ + fVar199 * auVar71._8_4_;
        auVar106._12_4_ = auVar105._12_4_ + fVar164 * auVar71._12_4_;
        auVar71 = vsubps_avx(auVar193,auVar138);
        auVar139._0_4_ = auVar138._0_4_ + fVar163 * auVar71._0_4_;
        auVar139._4_4_ = auVar138._4_4_ + fVar225 * auVar71._4_4_;
        auVar139._8_4_ = auVar138._8_4_ + fVar199 * auVar71._8_4_;
        auVar139._12_4_ = auVar138._12_4_ + fVar164 * auVar71._12_4_;
        auVar71 = vsubps_avx(auVar139,auVar106);
        fVar163 = auVar106._0_4_ + fVar163 * auVar71._0_4_;
        fVar225 = auVar106._4_4_ + fVar225 * auVar71._4_4_;
        auVar75._0_8_ = CONCAT44(fVar225,fVar163);
        auVar75._8_4_ = auVar106._8_4_ + fVar199 * auVar71._8_4_;
        auVar75._12_4_ = auVar106._12_4_ + fVar164 * auVar71._12_4_;
        fVar199 = auVar71._0_4_ * 3.0;
        fVar164 = auVar71._4_4_ * 3.0;
        auVar107._0_8_ = CONCAT44(fVar164,fVar199);
        auVar107._8_4_ = auVar71._8_4_ * 3.0;
        auVar107._12_4_ = auVar71._12_4_ * 3.0;
        auVar140._8_8_ = auVar75._0_8_;
        auVar140._0_8_ = auVar75._0_8_;
        auVar71 = vshufpd_avx(auVar75,auVar75,3);
        auVar214 = vshufps_avx(auVar160,auVar160,0x55);
        auVar134 = vsubps_avx(auVar71,auVar140);
        auVar275._0_4_ = auVar134._0_4_ * auVar214._0_4_ + fVar163;
        auVar275._4_4_ = auVar134._4_4_ * auVar214._4_4_ + fVar225;
        auVar275._8_4_ = auVar134._8_4_ * auVar214._8_4_ + fVar163;
        auVar275._12_4_ = auVar134._12_4_ * auVar214._12_4_ + fVar225;
        auVar141._8_8_ = auVar107._0_8_;
        auVar141._0_8_ = auVar107._0_8_;
        auVar71 = vshufpd_avx(auVar107,auVar107,1);
        auVar71 = vsubps_avx(auVar71,auVar141);
        auVar108._0_4_ = auVar71._0_4_ * auVar214._0_4_ + fVar199;
        auVar108._4_4_ = auVar71._4_4_ * auVar214._4_4_ + fVar164;
        auVar108._8_4_ = auVar71._8_4_ * auVar214._8_4_ + fVar199;
        auVar108._12_4_ = auVar71._12_4_ * auVar214._12_4_ + fVar164;
        auVar214 = vmovshdup_avx(auVar108);
        auVar194._0_8_ = auVar214._0_8_ ^ 0x8000000080000000;
        auVar194._8_4_ = auVar214._8_4_ ^ 0x80000000;
        auVar194._12_4_ = auVar214._12_4_ ^ 0x80000000;
        auVar148 = vmovshdup_avx(auVar134);
        auVar71 = vunpcklps_avx(auVar148,auVar194);
        auVar115 = vshufps_avx(auVar71,auVar194,4);
        auVar76._0_8_ = auVar134._0_8_ ^ 0x8000000080000000;
        auVar76._8_4_ = -auVar134._8_4_;
        auVar76._12_4_ = -auVar134._12_4_;
        auVar71 = vmovlhps_avx(auVar76,auVar108);
        auVar103 = vshufps_avx(auVar71,auVar108,8);
        auVar71 = ZEXT416((uint)(auVar108._0_4_ * auVar148._0_4_ - auVar134._0_4_ * auVar214._0_4_))
        ;
        auVar214 = vshufps_avx(auVar71,auVar71,0);
        auVar71 = vdivps_avx(auVar115,auVar214);
        auVar214 = vdivps_avx(auVar103,auVar214);
        auVar103 = vinsertps_avx(auVar232,auVar286,0x1c);
        auVar134 = vinsertps_avx(auVar249,auVar292,0x1c);
        auVar104 = vinsertps_avx(auVar286,auVar232,0x4c);
        auVar67 = vinsertps_avx(auVar292,auVar249,0x4c);
        auVar148 = vmovsldup_avx(auVar71);
        auVar142._0_4_ = auVar148._0_4_ * auVar103._0_4_;
        auVar142._4_4_ = auVar148._4_4_ * auVar103._4_4_;
        auVar142._8_4_ = auVar148._8_4_ * auVar103._8_4_;
        auVar142._12_4_ = auVar148._12_4_ * auVar103._12_4_;
        auVar109._0_4_ = auVar134._0_4_ * auVar148._0_4_;
        auVar109._4_4_ = auVar134._4_4_ * auVar148._4_4_;
        auVar109._8_4_ = auVar134._8_4_ * auVar148._8_4_;
        auVar109._12_4_ = auVar134._12_4_ * auVar148._12_4_;
        auVar115 = vminps_avx(auVar142,auVar109);
        auVar148 = vmaxps_avx(auVar109,auVar142);
        auVar99 = vmovsldup_avx(auVar214);
        auVar293._0_4_ = auVar104._0_4_ * auVar99._0_4_;
        auVar293._4_4_ = auVar104._4_4_ * auVar99._4_4_;
        auVar293._8_4_ = auVar104._8_4_ * auVar99._8_4_;
        auVar293._12_4_ = auVar104._12_4_ * auVar99._12_4_;
        auVar143._0_4_ = auVar67._0_4_ * auVar99._0_4_;
        auVar143._4_4_ = auVar67._4_4_ * auVar99._4_4_;
        auVar143._8_4_ = auVar67._8_4_ * auVar99._8_4_;
        auVar143._12_4_ = auVar67._12_4_ * auVar99._12_4_;
        auVar99 = vminps_avx(auVar293,auVar143);
        auVar175._0_4_ = auVar115._0_4_ + auVar99._0_4_;
        auVar175._4_4_ = auVar115._4_4_ + auVar99._4_4_;
        auVar175._8_4_ = auVar115._8_4_ + auVar99._8_4_;
        auVar175._12_4_ = auVar115._12_4_ + auVar99._12_4_;
        auVar115 = vmaxps_avx(auVar143,auVar293);
        auVar99 = vsubps_avx(auVar261,auVar160);
        auVar130 = vsubps_avx(auVar269,auVar160);
        auVar110._0_4_ = auVar148._0_4_ + auVar115._0_4_;
        auVar110._4_4_ = auVar148._4_4_ + auVar115._4_4_;
        auVar110._8_4_ = auVar148._8_4_ + auVar115._8_4_;
        auVar110._12_4_ = auVar148._12_4_ + auVar115._12_4_;
        auVar144._8_8_ = 0x3f800000;
        auVar144._0_8_ = 0x3f800000;
        auVar148 = vsubps_avx(auVar144,auVar110);
        auVar115 = vsubps_avx(auVar144,auVar175);
        fVar165 = auVar99._0_4_;
        auVar176._0_4_ = fVar165 * auVar148._0_4_;
        fVar89 = auVar99._4_4_;
        auVar176._4_4_ = fVar89 * auVar148._4_4_;
        fVar90 = auVar99._8_4_;
        auVar176._8_4_ = fVar90 * auVar148._8_4_;
        fVar91 = auVar99._12_4_;
        auVar176._12_4_ = fVar91 * auVar148._12_4_;
        fVar199 = auVar130._0_4_;
        auVar111._0_4_ = fVar199 * auVar148._0_4_;
        fVar164 = auVar130._4_4_;
        auVar111._4_4_ = fVar164 * auVar148._4_4_;
        fVar226 = auVar130._8_4_;
        auVar111._8_4_ = fVar226 * auVar148._8_4_;
        fVar200 = auVar130._12_4_;
        auVar111._12_4_ = fVar200 * auVar148._12_4_;
        auVar262._0_4_ = fVar165 * auVar115._0_4_;
        auVar262._4_4_ = fVar89 * auVar115._4_4_;
        auVar262._8_4_ = fVar90 * auVar115._8_4_;
        auVar262._12_4_ = fVar91 * auVar115._12_4_;
        auVar145._0_4_ = fVar199 * auVar115._0_4_;
        auVar145._4_4_ = fVar164 * auVar115._4_4_;
        auVar145._8_4_ = fVar226 * auVar115._8_4_;
        auVar145._12_4_ = fVar200 * auVar115._12_4_;
        auVar148 = vminps_avx(auVar176,auVar262);
        auVar115 = vminps_avx(auVar111,auVar145);
        auVar99 = vminps_avx(auVar148,auVar115);
        auVar148 = vmaxps_avx(auVar262,auVar176);
        auVar115 = vmaxps_avx(auVar145,auVar111);
        auVar130 = vshufps_avx(auVar160,auVar160,0x54);
        auVar115 = vmaxps_avx(auVar115,auVar148);
        auVar169 = vshufps_avx(auVar275,auVar275,0);
        auVar185 = vshufps_avx(auVar275,auVar275,0x55);
        auVar148 = vhaddps_avx(auVar99,auVar99);
        auVar115 = vhaddps_avx(auVar115,auVar115);
        auVar161._0_4_ = auVar169._0_4_ * auVar71._0_4_ + auVar185._0_4_ * auVar214._0_4_;
        auVar161._4_4_ = auVar169._4_4_ * auVar71._4_4_ + auVar185._4_4_ * auVar214._4_4_;
        auVar161._8_4_ = auVar169._8_4_ * auVar71._8_4_ + auVar185._8_4_ * auVar214._8_4_;
        auVar161._12_4_ = auVar169._12_4_ * auVar71._12_4_ + auVar185._12_4_ * auVar214._12_4_;
        auVar99 = vsubps_avx(auVar130,auVar161);
        fVar163 = auVar99._0_4_ + auVar148._0_4_;
        fVar225 = auVar99._0_4_ + auVar115._0_4_;
        auVar148 = vmaxss_avx(ZEXT416((uint)fVar198),ZEXT416((uint)fVar163));
        auVar115 = vminss_avx(ZEXT416((uint)fVar225),ZEXT416((uint)fVar153));
      } while (auVar115._0_4_ < auVar148._0_4_);
      auVar148 = vmovshdup_avx(auVar71);
      auVar77._0_4_ = auVar148._0_4_ * auVar103._0_4_;
      auVar77._4_4_ = auVar148._4_4_ * auVar103._4_4_;
      auVar77._8_4_ = auVar148._8_4_ * auVar103._8_4_;
      auVar77._12_4_ = auVar148._12_4_ * auVar103._12_4_;
      auVar112._0_4_ = auVar134._0_4_ * auVar148._0_4_;
      auVar112._4_4_ = auVar134._4_4_ * auVar148._4_4_;
      auVar112._8_4_ = auVar134._8_4_ * auVar148._8_4_;
      auVar112._12_4_ = auVar134._12_4_ * auVar148._12_4_;
      auVar115 = vminps_avx(auVar77,auVar112);
      auVar148 = vmaxps_avx(auVar112,auVar77);
      auVar103 = vmovshdup_avx(auVar214);
      auVar177._0_4_ = auVar104._0_4_ * auVar103._0_4_;
      auVar177._4_4_ = auVar104._4_4_ * auVar103._4_4_;
      auVar177._8_4_ = auVar104._8_4_ * auVar103._8_4_;
      auVar177._12_4_ = auVar104._12_4_ * auVar103._12_4_;
      auVar113._0_4_ = auVar67._0_4_ * auVar103._0_4_;
      auVar113._4_4_ = auVar67._4_4_ * auVar103._4_4_;
      auVar113._8_4_ = auVar67._8_4_ * auVar103._8_4_;
      auVar113._12_4_ = auVar67._12_4_ * auVar103._12_4_;
      auVar103 = vminps_avx(auVar177,auVar113);
      auVar146._0_4_ = auVar115._0_4_ + auVar103._0_4_;
      auVar146._4_4_ = auVar115._4_4_ + auVar103._4_4_;
      auVar146._8_4_ = auVar115._8_4_ + auVar103._8_4_;
      auVar146._12_4_ = auVar115._12_4_ + auVar103._12_4_;
      auVar115 = vmaxps_avx(auVar113,auVar177);
      auVar78._0_4_ = auVar148._0_4_ + auVar115._0_4_;
      auVar78._4_4_ = auVar148._4_4_ + auVar115._4_4_;
      auVar78._8_4_ = auVar148._8_4_ + auVar115._8_4_;
      auVar78._12_4_ = auVar148._12_4_ + auVar115._12_4_;
      auVar148 = vsubps_avx(auVar209,auVar78);
      auVar115 = vsubps_avx(auVar209,auVar146);
      auVar147._0_4_ = fVar165 * auVar148._0_4_;
      auVar147._4_4_ = fVar89 * auVar148._4_4_;
      auVar147._8_4_ = fVar90 * auVar148._8_4_;
      auVar147._12_4_ = fVar91 * auVar148._12_4_;
      auVar178._0_4_ = fVar165 * auVar115._0_4_;
      auVar178._4_4_ = fVar89 * auVar115._4_4_;
      auVar178._8_4_ = fVar90 * auVar115._8_4_;
      auVar178._12_4_ = fVar91 * auVar115._12_4_;
      auVar79._0_4_ = fVar199 * auVar148._0_4_;
      auVar79._4_4_ = fVar164 * auVar148._4_4_;
      auVar79._8_4_ = fVar226 * auVar148._8_4_;
      auVar79._12_4_ = fVar200 * auVar148._12_4_;
      auVar114._0_4_ = fVar199 * auVar115._0_4_;
      auVar114._4_4_ = fVar164 * auVar115._4_4_;
      auVar114._8_4_ = fVar226 * auVar115._8_4_;
      auVar114._12_4_ = fVar200 * auVar115._12_4_;
      auVar148 = vminps_avx(auVar147,auVar178);
      auVar115 = vminps_avx(auVar79,auVar114);
      auVar148 = vminps_avx(auVar148,auVar115);
      auVar115 = vmaxps_avx(auVar178,auVar147);
      auVar103 = vmaxps_avx(auVar114,auVar79);
      auVar148 = vhaddps_avx(auVar148,auVar148);
      auVar115 = vmaxps_avx(auVar103,auVar115);
      auVar115 = vhaddps_avx(auVar115,auVar115);
      auVar103 = vmovshdup_avx(auVar99);
      auVar134 = ZEXT416((uint)(auVar103._0_4_ + auVar148._0_4_));
      auVar148 = vmaxss_avx(auVar211,auVar134);
      auVar103 = ZEXT416((uint)(auVar103._0_4_ + auVar115._0_4_));
      auVar115 = vminss_avx(auVar103,auVar129);
    } while (auVar115._0_4_ < auVar148._0_4_);
    uVar54 = 0;
    if ((fVar198 < fVar163) && (fVar225 < fVar153)) {
      auVar148 = vcmpps_avx(auVar103,auVar129,1);
      auVar115 = vcmpps_avx(auVar211,auVar134,1);
      auVar148 = vandps_avx(auVar115,auVar148);
      uVar54 = auVar148._0_4_;
    }
    auVar233._8_4_ = 0x7fffffff;
    auVar233._0_8_ = 0x7fffffff7fffffff;
    auVar233._12_4_ = 0x7fffffff;
    p03.field_0.i[0] = auVar64._0_4_;
    p03.field_0.i[1] = auVar64._4_4_;
    p03.field_0.i[2] = auVar64._8_4_;
    p03.field_0.i[3] = auVar64._12_4_;
    if ((3 < (uint)uVar59 || fVar224 < 0.001) || (uVar54 & 1) != 0) {
      lVar56 = 0xc9;
      do {
        lVar56 = lVar56 + -1;
        if (lVar56 == 0) goto LAB_007cfbda;
        fVar224 = auVar99._0_4_;
        fVar153 = 1.0 - fVar224;
        auVar148 = ZEXT416((uint)(fVar153 * fVar153 * fVar153));
        auVar148 = vshufps_avx(auVar148,auVar148,0);
        auVar115 = ZEXT416((uint)(fVar224 * 3.0 * fVar153 * fVar153));
        auVar115 = vshufps_avx(auVar115,auVar115,0);
        auVar103 = ZEXT416((uint)(fVar153 * fVar224 * fVar224 * 3.0));
        auVar103 = vshufps_avx(auVar103,auVar103,0);
        auVar134 = ZEXT416((uint)(fVar224 * fVar224 * fVar224));
        auVar134 = vshufps_avx(auVar134,auVar134,0);
        fVar153 = p00.field_0.v[0] * auVar148._0_4_ +
                  p01.field_0.v[0] * auVar115._0_4_ +
                  p03.field_0.v[0] * auVar134._0_4_ + p02.field_0.v[0] * auVar103._0_4_;
        fVar224 = p00.field_0.v[1] * auVar148._4_4_ +
                  p01.field_0.v[1] * auVar115._4_4_ +
                  p03.field_0.v[1] * auVar134._4_4_ + p02.field_0.v[1] * auVar103._4_4_;
        auVar80._0_8_ = CONCAT44(fVar224,fVar153);
        auVar80._8_4_ =
             p00.field_0.v[2] * auVar148._8_4_ +
             p01.field_0.v[2] * auVar115._8_4_ +
             p03.field_0.v[2] * auVar134._8_4_ + p02.field_0.v[2] * auVar103._8_4_;
        auVar80._12_4_ =
             p00.field_0.v[3] * auVar148._12_4_ +
             p01.field_0.v[3] * auVar115._12_4_ +
             p03.field_0.v[3] * auVar134._12_4_ + p02.field_0.v[3] * auVar103._12_4_;
        auVar116._8_8_ = auVar80._0_8_;
        auVar116._0_8_ = auVar80._0_8_;
        auVar115 = vshufpd_avx(auVar80,auVar80,1);
        auVar148 = vmovshdup_avx(auVar99);
        auVar115 = vsubps_avx(auVar115,auVar116);
        auVar81._0_4_ = auVar148._0_4_ * auVar115._0_4_ + fVar153;
        auVar81._4_4_ = auVar148._4_4_ * auVar115._4_4_ + fVar224;
        auVar81._8_4_ = auVar148._8_4_ * auVar115._8_4_ + fVar153;
        auVar81._12_4_ = auVar148._12_4_ * auVar115._12_4_ + fVar224;
        auVar148 = vshufps_avx(auVar81,auVar81,0);
        auVar115 = vshufps_avx(auVar81,auVar81,0x55);
        auVar117._0_4_ = auVar71._0_4_ * auVar148._0_4_ + auVar214._0_4_ * auVar115._0_4_;
        auVar117._4_4_ = auVar71._4_4_ * auVar148._4_4_ + auVar214._4_4_ * auVar115._4_4_;
        auVar117._8_4_ = auVar71._8_4_ * auVar148._8_4_ + auVar214._8_4_ * auVar115._8_4_;
        auVar117._12_4_ = auVar71._12_4_ * auVar148._12_4_ + auVar214._12_4_ * auVar115._12_4_;
        auVar99 = vsubps_avx(auVar99,auVar117);
        auVar148 = vandps_avx(auVar233,auVar81);
        auVar115 = vshufps_avx(auVar148,auVar148,0xf5);
        auVar148 = vmaxss_avx(auVar115,auVar148);
      } while (fVar183 <= auVar148._0_4_);
      fVar153 = auVar99._0_4_;
      if ((0.0 <= fVar153) && (fVar153 <= 1.0)) {
        auVar71 = vmovshdup_avx(auVar99);
        fVar224 = auVar71._0_4_;
        if ((0.0 <= fVar224) && (fVar224 <= 1.0)) {
          auVar71 = vinsertps_avx(ZEXT416((uint)(pLVar53->vx).field_0.m128[2]),
                                  ZEXT416((uint)(pLVar53->vy).field_0.m128[2]),0x1c);
          auVar67 = vinsertps_avx(auVar71,ZEXT416((uint)(pLVar53->vz).field_0.m128[2]),0x28);
          auVar71 = vdpps_avx(auVar67,auVar65,0x7f);
          auVar214 = vdpps_avx(auVar67,auVar98,0x7f);
          auVar148 = vdpps_avx(auVar67,auVar127,0x7f);
          auVar115 = vdpps_avx(auVar67,auVar96,0x7f);
          auVar103 = vdpps_avx(auVar67,auVar154,0x7f);
          auVar134 = vdpps_avx(auVar67,auVar155,0x7f);
          fVar164 = 1.0 - fVar224;
          auVar104 = vdpps_avx(auVar67,auVar63,0x7f);
          auVar67 = vdpps_avx(auVar67,auVar97,0x7f);
          fVar226 = 1.0 - fVar153;
          fVar198 = auVar99._4_4_;
          fVar163 = auVar99._8_4_;
          fVar225 = auVar99._12_4_;
          fVar199 = fVar226 * fVar153 * fVar153 * 3.0;
          auVar195._0_4_ = fVar153 * fVar153 * fVar153;
          auVar195._4_4_ = fVar198 * fVar198 * fVar198;
          auVar195._8_4_ = fVar163 * fVar163 * fVar163;
          auVar195._12_4_ = fVar225 * fVar225 * fVar225;
          fVar198 = fVar153 * 3.0 * fVar226 * fVar226;
          fVar163 = fVar226 * fVar226 * fVar226;
          fVar153 = (fVar164 * auVar71._0_4_ + fVar224 * auVar148._0_4_) * fVar163 +
                    (fVar164 * auVar214._0_4_ + fVar224 * auVar115._0_4_) * fVar198 +
                    fVar199 * (fVar164 * auVar104._0_4_ + fVar224 * auVar103._0_4_) +
                    auVar195._0_4_ * (auVar134._0_4_ * fVar224 + fVar164 * auVar67._0_4_);
          if ((fVar213 <= fVar153) && (fVar224 = *(float *)(ray + k * 4 + 0x80), fVar153 <= fVar224)
             ) {
            pGVar4 = (context->scene->geometries).items[uVar55].ptr;
            if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              bVar62 = false;
            }
            else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                    (bVar62 = true, pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              local_1e8 = vshufps_avx(auVar99,auVar99,0x55);
              auVar234._8_4_ = 0x3f800000;
              auVar234._0_8_ = 0x3f8000003f800000;
              auVar234._12_4_ = 0x3f800000;
              auVar71 = vsubps_avx(auVar234,local_1e8);
              fVar225 = local_1e8._0_4_;
              fVar164 = local_1e8._4_4_;
              fVar200 = local_1e8._8_4_;
              fVar165 = local_1e8._12_4_;
              local_348 = auVar128._0_4_;
              fStack_344 = auVar128._4_4_;
              fStack_340 = auVar128._8_4_;
              fStack_33c = auVar128._12_4_;
              fVar89 = auVar71._0_4_;
              fVar90 = auVar71._4_4_;
              fVar91 = auVar71._8_4_;
              fVar92 = auVar71._12_4_;
              auVar250._0_4_ = fVar225 * (float)local_428._0_4_ + fVar89 * (float)local_418._0_4_;
              auVar250._4_4_ = fVar164 * (float)local_428._4_4_ + fVar90 * (float)local_418._4_4_;
              auVar250._8_4_ = fVar200 * fStack_420 + fVar91 * fStack_410;
              auVar250._12_4_ = fVar165 * fStack_41c + fVar92 * fStack_40c;
              auVar263._0_4_ = fVar225 * (float)local_478._0_4_ + fVar89 * (float)local_458._0_4_;
              auVar263._4_4_ = fVar164 * (float)local_478._4_4_ + fVar90 * (float)local_458._4_4_;
              auVar263._8_4_ = fVar200 * fStack_470 + fVar91 * fStack_450;
              auVar263._12_4_ = fVar165 * fStack_46c + fVar92 * fStack_44c;
              auVar270._0_4_ = fVar225 * local_348 + fVar89 * (float)local_468._0_4_;
              auVar270._4_4_ = fVar164 * fStack_344 + fVar90 * (float)local_468._4_4_;
              auVar270._8_4_ = fVar200 * fStack_340 + fVar91 * fStack_460;
              auVar270._12_4_ = fVar165 * fStack_33c + fVar92 * fStack_45c;
              auVar235._0_4_ = fVar225 * (float)local_448._0_4_ + fVar89 * (float)local_438._0_4_;
              auVar235._4_4_ = fVar164 * (float)local_448._4_4_ + fVar90 * (float)local_438._4_4_;
              auVar235._8_4_ = fVar200 * fStack_440 + fVar91 * fStack_430;
              auVar235._12_4_ = fVar165 * fStack_43c + fVar92 * fStack_42c;
              auVar115 = vsubps_avx(auVar263,auVar250);
              auVar103 = vsubps_avx(auVar270,auVar263);
              auVar134 = vsubps_avx(auVar235,auVar270);
              local_1f8 = vshufps_avx(auVar99,auVar99,0);
              fVar225 = local_1f8._0_4_;
              fVar200 = local_1f8._4_4_;
              fVar165 = local_1f8._8_4_;
              fVar90 = local_1f8._12_4_;
              auVar71 = vshufps_avx(ZEXT416((uint)fVar226),ZEXT416((uint)fVar226),0);
              fVar164 = auVar71._0_4_;
              fVar226 = auVar71._4_4_;
              fVar89 = auVar71._8_4_;
              fVar91 = auVar71._12_4_;
              auVar71 = vshufps_avx(auVar195,auVar195,0);
              local_3a8 = auVar203._0_4_;
              fStack_3a4 = auVar203._4_4_;
              fStack_3a0 = auVar203._8_4_;
              fStack_39c = auVar203._12_4_;
              auVar214 = vshufps_avx(ZEXT416((uint)fVar199),ZEXT416((uint)fVar199),0);
              local_398 = auVar202._0_4_;
              fStack_394 = auVar202._4_4_;
              fStack_390 = auVar202._8_4_;
              fStack_38c = auVar202._12_4_;
              auVar148 = vshufps_avx(ZEXT416((uint)fVar198),ZEXT416((uint)fVar198),0);
              local_388 = auVar184._0_4_;
              fStack_384 = auVar184._4_4_;
              fStack_380 = auVar184._8_4_;
              fStack_37c = auVar184._12_4_;
              auVar179._0_4_ =
                   ((auVar103._0_4_ * fVar164 + auVar134._0_4_ * fVar225) * fVar225 +
                   (auVar115._0_4_ * fVar164 + auVar103._0_4_ * fVar225) * fVar164) * 3.0;
              auVar179._4_4_ =
                   ((auVar103._4_4_ * fVar226 + auVar134._4_4_ * fVar200) * fVar200 +
                   (auVar115._4_4_ * fVar226 + auVar103._4_4_ * fVar200) * fVar226) * 3.0;
              auVar179._8_4_ =
                   ((auVar103._8_4_ * fVar89 + auVar134._8_4_ * fVar165) * fVar165 +
                   (auVar115._8_4_ * fVar89 + auVar103._8_4_ * fVar165) * fVar89) * 3.0;
              auVar179._12_4_ =
                   ((auVar103._12_4_ * fVar91 + auVar134._12_4_ * fVar90) * fVar90 +
                   (auVar115._12_4_ * fVar91 + auVar103._12_4_ * fVar90) * fVar91) * 3.0;
              auVar115 = vshufps_avx(ZEXT416((uint)fVar163),ZEXT416((uint)fVar163),0);
              local_378 = auVar168._0_4_;
              fStack_374 = auVar168._4_4_;
              fStack_370 = auVar168._8_4_;
              fStack_36c = auVar168._12_4_;
              auVar118._0_4_ =
                   auVar115._0_4_ * local_378 +
                   auVar148._0_4_ * local_388 +
                   auVar71._0_4_ * local_3a8 + auVar214._0_4_ * local_398;
              auVar118._4_4_ =
                   auVar115._4_4_ * fStack_374 +
                   auVar148._4_4_ * fStack_384 +
                   auVar71._4_4_ * fStack_3a4 + auVar214._4_4_ * fStack_394;
              auVar118._8_4_ =
                   auVar115._8_4_ * fStack_370 +
                   auVar148._8_4_ * fStack_380 +
                   auVar71._8_4_ * fStack_3a0 + auVar214._8_4_ * fStack_390;
              auVar118._12_4_ =
                   auVar115._12_4_ * fStack_36c +
                   auVar148._12_4_ * fStack_37c +
                   auVar71._12_4_ * fStack_39c + auVar214._12_4_ * fStack_38c;
              auVar71 = vshufps_avx(auVar179,auVar179,0xc9);
              auVar149._0_4_ = auVar118._0_4_ * auVar71._0_4_;
              auVar149._4_4_ = auVar118._4_4_ * auVar71._4_4_;
              auVar149._8_4_ = auVar118._8_4_ * auVar71._8_4_;
              auVar149._12_4_ = auVar118._12_4_ * auVar71._12_4_;
              auVar71 = vshufps_avx(auVar118,auVar118,0xc9);
              auVar119._0_4_ = auVar179._0_4_ * auVar71._0_4_;
              auVar119._4_4_ = auVar179._4_4_ * auVar71._4_4_;
              auVar119._8_4_ = auVar179._8_4_ * auVar71._8_4_;
              auVar119._12_4_ = auVar179._12_4_ * auVar71._12_4_;
              auVar214 = vsubps_avx(auVar119,auVar149);
              auVar71 = vshufps_avx(auVar214,auVar214,0x55);
              local_228[0] = (RTCHitN)auVar71[0];
              local_228[1] = (RTCHitN)auVar71[1];
              local_228[2] = (RTCHitN)auVar71[2];
              local_228[3] = (RTCHitN)auVar71[3];
              local_228[4] = (RTCHitN)auVar71[4];
              local_228[5] = (RTCHitN)auVar71[5];
              local_228[6] = (RTCHitN)auVar71[6];
              local_228[7] = (RTCHitN)auVar71[7];
              local_228[8] = (RTCHitN)auVar71[8];
              local_228[9] = (RTCHitN)auVar71[9];
              local_228[10] = (RTCHitN)auVar71[10];
              local_228[0xb] = (RTCHitN)auVar71[0xb];
              local_228[0xc] = (RTCHitN)auVar71[0xc];
              local_228[0xd] = (RTCHitN)auVar71[0xd];
              local_228[0xe] = (RTCHitN)auVar71[0xe];
              local_228[0xf] = (RTCHitN)auVar71[0xf];
              local_218 = vshufps_avx(auVar214,auVar214,0xaa);
              local_208 = vshufps_avx(auVar214,auVar214,0);
              local_368 = auVar247._0_8_;
              uStack_360 = auVar247._8_8_;
              local_1d8 = local_368;
              uStack_1d0 = uStack_360;
              local_1c8 = auVar219;
              vcmpps_avx(ZEXT1632(auVar219),ZEXT1632(auVar219),0xf);
              uStack_1b4 = context->user->instID[0];
              local_1b8 = uStack_1b4;
              uStack_1b0 = uStack_1b4;
              uStack_1ac = uStack_1b4;
              uStack_1a8 = context->user->instPrimID[0];
              uStack_1a4 = uStack_1a8;
              uStack_1a0 = uStack_1a8;
              uStack_19c = uStack_1a8;
              *(float *)(ray + k * 4 + 0x80) = fVar153;
              local_4a8 = *local_490;
              args.valid = (int *)local_4a8;
              args.geometryUserPtr = pGVar4->userPtr;
              args.context = context->user;
              args.ray = (RTCRayN *)ray;
              args.hit = local_228;
              args.N = 4;
              if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar4->occlusionFilterN)(&args);
              }
              if (local_4a8 == (undefined1  [16])0x0) {
                auVar71 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                auVar71 = auVar71 ^ _DAT_01f46b70;
              }
              else {
                p_Var5 = context->args->filter;
                if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0))))
                {
                  (*p_Var5)(&args);
                }
                auVar214 = vpcmpeqd_avx(local_4a8,_DAT_01f45a50);
                auVar71 = auVar214 ^ _DAT_01f46b70;
                auVar150._8_4_ = 0xff800000;
                auVar150._0_8_ = 0xff800000ff800000;
                auVar150._12_4_ = 0xff800000;
                auVar214 = vblendvps_avx(auVar150,*(undefined1 (*) [16])(args.ray + 0x80),auVar214);
                *(undefined1 (*) [16])(args.ray + 0x80) = auVar214;
              }
              auVar120._8_8_ = 0x100000001;
              auVar120._0_8_ = 0x100000001;
              bVar62 = (auVar120 & auVar71) != (undefined1  [16])0x0;
              if (!bVar62) {
                *(float *)(ray + k * 4 + 0x80) = fVar224;
              }
            }
            bVar60 = (bool)(bVar60 | bVar62);
          }
        }
      }
      goto LAB_007cfbda;
    }
    auVar71 = vinsertps_avx(ZEXT416((uint)fVar198),ZEXT416((uint)fVar153),0x10);
    auVar297 = ZEXT1664(auVar71);
    auVar295 = ZEXT1664(auVar211);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }